

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx2::forward
          (Convolution1D_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  _func_int *p_Var7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int *piVar28;
  void *pvVar29;
  int iVar30;
  void *pvVar31;
  uint uVar32;
  float *pfVar33;
  int iVar34;
  int iVar35;
  uint *puVar36;
  int iVar37;
  undefined4 *puVar38;
  uint _w;
  undefined4 *puVar39;
  float *pfVar40;
  uint *puVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [16];
  float *pfVar46;
  ulong uVar47;
  uint *puVar48;
  ulong uVar49;
  undefined1 (*pauVar50) [32];
  float *pfVar51;
  int iVar52;
  long lVar53;
  ulong uVar54;
  long lVar55;
  undefined1 (*pauVar56) [32];
  undefined1 (*pauVar57) [16];
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [28];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar221;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar360;
  float fVar361;
  float fVar363;
  float fVar364;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar362;
  float fVar365;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [64];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [64];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [64];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [64];
  undefined1 auVar464 [64];
  ulong local_160;
  ulong local_150;
  Mat local_b8;
  long local_70;
  void *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  uVar49 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elempack = 0;
  local_b8.h = 0;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.d = (int)local_b8.refcount;
  local_b8.c = local_b8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx2 + (long)p_Var4),bottom_blob
             ,&local_b8,opt);
  iVar30 = local_b8.h;
  iVar52 = -100;
  if (((Allocator *)local_b8.data != (Allocator *)0x0) && ((long)local_b8.c * local_b8.cstep != 0))
  {
    uVar32 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]);
    lVar53 = 1;
    if (opt->use_packing_layout == true) {
      lVar53 = 8;
      if ((uVar32 & 7) != 0) {
        lVar53 = (ulong)((uVar32 & 3) == 0) * 3 + 1;
      }
    }
    uVar54 = (ulong)(uint)local_b8.h;
    iVar35 = (int)lVar53;
    iVar3 = (local_b8.w + ~((iVar3 + -1) * iVar37)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx2[-3]);
    _w = iVar3 + 1;
    uVar32 = (int)uVar32 / iVar35;
    Mat::create(top_blob,_w,uVar32,lVar53 * (uVar49 / (ulong)(long)iVar2),iVar35,opt->blob_allocator
               );
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar58 = iVar35 == 8;
      bVar60 = 0 < (int)uVar32;
      if (iVar2 == 8 && (bVar60 && bVar58)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_160 = 0;
        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar389 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar310._8_4_ = 0x3f800000;
        auVar310._0_8_ = 0x3f8000003f800000;
        auVar310._12_4_ = 0x3f800000;
        auVar310._16_4_ = 0x3f800000;
        auVar310._20_4_ = 0x3f800000;
        auVar310._24_4_ = 0x3f800000;
        auVar310._28_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar43 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar179 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_160 * 0x20));
              }
              if (iVar30 < 1) {
                auVar428 = ZEXT3264(auVar179._0_32_);
              }
              else {
                pauVar56 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_160 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                puVar39 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar52) * 4 + 4);
                uVar49 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                    auVar428 = ZEXT3264(auVar179._0_32_);
                  }
                  else {
                    puVar38 = puVar39;
                    iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      uVar1 = puVar38[-7];
                      auVar410._4_4_ = uVar1;
                      auVar410._0_4_ = uVar1;
                      auVar410._8_4_ = uVar1;
                      auVar410._12_4_ = uVar1;
                      auVar410._16_4_ = uVar1;
                      auVar410._20_4_ = uVar1;
                      auVar410._24_4_ = uVar1;
                      auVar410._28_4_ = uVar1;
                      uVar1 = puVar38[-6];
                      auVar305._4_4_ = uVar1;
                      auVar305._0_4_ = uVar1;
                      auVar305._8_4_ = uVar1;
                      auVar305._12_4_ = uVar1;
                      auVar305._16_4_ = uVar1;
                      auVar305._20_4_ = uVar1;
                      auVar305._24_4_ = uVar1;
                      auVar305._28_4_ = uVar1;
                      uVar1 = puVar38[-5];
                      auVar336._4_4_ = uVar1;
                      auVar336._0_4_ = uVar1;
                      auVar336._8_4_ = uVar1;
                      auVar336._12_4_ = uVar1;
                      auVar336._16_4_ = uVar1;
                      auVar336._20_4_ = uVar1;
                      auVar336._24_4_ = uVar1;
                      auVar336._28_4_ = uVar1;
                      uVar1 = puVar38[-4];
                      auVar304._4_4_ = uVar1;
                      auVar304._0_4_ = uVar1;
                      auVar304._8_4_ = uVar1;
                      auVar304._12_4_ = uVar1;
                      auVar304._16_4_ = uVar1;
                      auVar304._20_4_ = uVar1;
                      auVar304._24_4_ = uVar1;
                      auVar304._28_4_ = uVar1;
                      uVar1 = puVar38[-3];
                      auVar335._4_4_ = uVar1;
                      auVar335._0_4_ = uVar1;
                      auVar335._8_4_ = uVar1;
                      auVar335._12_4_ = uVar1;
                      auVar335._16_4_ = uVar1;
                      auVar335._20_4_ = uVar1;
                      auVar335._24_4_ = uVar1;
                      auVar335._28_4_ = uVar1;
                      uVar1 = puVar38[-2];
                      auVar447._4_4_ = uVar1;
                      auVar447._0_4_ = uVar1;
                      auVar447._8_4_ = uVar1;
                      auVar447._12_4_ = uVar1;
                      auVar447._16_4_ = uVar1;
                      auVar447._20_4_ = uVar1;
                      auVar447._24_4_ = uVar1;
                      auVar447._28_4_ = uVar1;
                      uVar1 = puVar38[-1];
                      auVar354._4_4_ = uVar1;
                      auVar354._0_4_ = uVar1;
                      auVar354._8_4_ = uVar1;
                      auVar354._12_4_ = uVar1;
                      auVar354._16_4_ = uVar1;
                      auVar354._20_4_ = uVar1;
                      auVar354._24_4_ = uVar1;
                      auVar354._28_4_ = uVar1;
                      uVar1 = *puVar38;
                      auVar372._4_4_ = uVar1;
                      auVar372._0_4_ = uVar1;
                      auVar372._8_4_ = uVar1;
                      auVar372._12_4_ = uVar1;
                      auVar372._16_4_ = uVar1;
                      auVar372._20_4_ = uVar1;
                      auVar372._24_4_ = uVar1;
                      auVar372._28_4_ = uVar1;
                      auVar325 = vfmadd132ps_fma(auVar410,auVar179._0_32_,*pauVar56);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar305,pauVar56[1]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar336,pauVar56[2]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar304,pauVar56[3]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar335,pauVar56[4]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar447,pauVar56[5]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar354,pauVar56[6]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar372,pauVar56[7]);
                      auVar428 = ZEXT1664(auVar325);
                      pauVar56 = pauVar56 + 8;
                      puVar38 = puVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      auVar179 = ZEXT1664(auVar325);
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  uVar49 = uVar49 + 1;
                  puVar39 = (undefined4 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
                  auVar179 = ZEXT3264(auVar428._0_32_);
                } while (uVar49 != uVar54);
              }
              auVar305 = auVar428._0_32_;
              auVar336 = auVar381._0_32_;
              auVar304 = auVar389._0_32_;
              auVar179._28_36_ = auVar428._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar305 = vmaxps_avx(auVar305,auVar336);
                break;
              case 2:
                auVar304 = vmaxps_avx(auVar305,auVar336);
                auVar305 = vminps_avx(auVar305,auVar336);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar411._4_4_ = uVar1;
                auVar411._0_4_ = uVar1;
                auVar411._8_4_ = uVar1;
                auVar411._12_4_ = uVar1;
                auVar411._16_4_ = uVar1;
                auVar411._20_4_ = uVar1;
                auVar411._24_4_ = uVar1;
                auVar411._28_4_ = uVar1;
                auVar325 = vfmadd213ps_fma(auVar411,auVar305,auVar304);
                auVar305 = ZEXT1632(auVar325);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar162._4_4_ = uVar1;
                auVar162._0_4_ = uVar1;
                auVar162._8_4_ = uVar1;
                auVar162._12_4_ = uVar1;
                auVar162._16_4_ = uVar1;
                auVar162._20_4_ = uVar1;
                auVar162._24_4_ = uVar1;
                auVar162._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar307._4_4_ = uVar1;
                auVar307._0_4_ = uVar1;
                auVar307._8_4_ = uVar1;
                auVar307._12_4_ = uVar1;
                auVar307._16_4_ = uVar1;
                auVar307._20_4_ = uVar1;
                auVar307._24_4_ = uVar1;
                auVar307._28_4_ = uVar1;
                auVar305 = vmaxps_avx(auVar305,auVar162);
                auVar305 = vminps_avx(auVar305,auVar307);
                break;
              case 4:
                auVar163._0_8_ = auVar428._0_8_ ^ 0x8000000080000000;
                auVar163._8_4_ = -auVar428._8_4_;
                auVar163._12_4_ = -auVar428._12_4_;
                auVar163._16_4_ = -auVar428._16_4_;
                auVar163._20_4_ = -auVar428._20_4_;
                auVar163._24_4_ = -auVar428._24_4_;
                auVar163._28_4_ = auVar428._28_4_ ^ 0x80000000;
                auVar240._8_4_ = 0x42b0c0a5;
                auVar240._0_8_ = 0x42b0c0a542b0c0a5;
                auVar240._12_4_ = 0x42b0c0a5;
                auVar240._16_4_ = 0x42b0c0a5;
                auVar240._20_4_ = 0x42b0c0a5;
                auVar240._24_4_ = 0x42b0c0a5;
                auVar240._28_4_ = 0x42b0c0a5;
                auVar305 = vminps_avx(auVar163,auVar240);
                auVar241._8_4_ = 0xc2b0c0a5;
                auVar241._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar241._12_4_ = 0xc2b0c0a5;
                auVar241._16_4_ = 0xc2b0c0a5;
                auVar241._20_4_ = 0xc2b0c0a5;
                auVar241._24_4_ = 0xc2b0c0a5;
                auVar241._28_4_ = 0xc2b0c0a5;
                auVar336 = vmaxps_avx(auVar305,auVar241);
                auVar308._8_4_ = 0x3fb8aa3b;
                auVar308._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar308._12_4_ = 0x3fb8aa3b;
                auVar308._16_4_ = 0x3fb8aa3b;
                auVar308._20_4_ = 0x3fb8aa3b;
                auVar308._24_4_ = 0x3fb8aa3b;
                auVar308._28_4_ = 0x3fb8aa3b;
                auVar325 = vfmadd213ps_fma(auVar308,auVar336,auVar304);
                auVar335 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar305 = vcmpps_avx(ZEXT1632(auVar325),auVar335,1);
                auVar305 = vandps_avx(auVar305,auVar310);
                auVar305 = vsubps_avx(auVar335,auVar305);
                auVar242._8_4_ = 0xbf317218;
                auVar242._0_8_ = 0xbf317218bf317218;
                auVar242._12_4_ = 0xbf317218;
                auVar242._16_4_ = 0xbf317218;
                auVar242._20_4_ = 0xbf317218;
                auVar242._24_4_ = 0xbf317218;
                auVar242._28_4_ = 0xbf317218;
                auVar320 = vfmadd231ps_fma(auVar336,auVar305,auVar242);
                auVar336 = ZEXT1632(auVar320);
                fVar63 = auVar320._0_4_;
                fVar360 = auVar320._4_4_;
                fVar361 = auVar320._8_4_;
                fVar362 = auVar320._12_4_;
                auVar17._28_4_ = auVar335._28_4_;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(fVar362 * fVar362,
                                        CONCAT48(fVar361 * fVar361,
                                                 CONCAT44(fVar360 * fVar360,fVar63 * fVar63))));
                auVar338._8_4_ = 0x39506967;
                auVar338._0_8_ = 0x3950696739506967;
                auVar338._12_4_ = 0x39506967;
                auVar338._16_4_ = 0x39506967;
                auVar338._20_4_ = 0x39506967;
                auVar338._24_4_ = 0x39506967;
                auVar338._28_4_ = 0x39506967;
                auVar243._8_4_ = 0x3ab743ce;
                auVar243._0_8_ = 0x3ab743ce3ab743ce;
                auVar243._12_4_ = 0x3ab743ce;
                auVar243._16_4_ = 0x3ab743ce;
                auVar243._20_4_ = 0x3ab743ce;
                auVar243._24_4_ = 0x3ab743ce;
                auVar243._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar338,auVar336,auVar243);
                auVar212._8_4_ = 0x3c088908;
                auVar212._0_8_ = 0x3c0889083c088908;
                auVar212._12_4_ = 0x3c088908;
                auVar212._16_4_ = 0x3c088908;
                auVar212._20_4_ = 0x3c088908;
                auVar212._24_4_ = 0x3c088908;
                auVar212._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar212);
                auVar116._8_4_ = 0x3d2aa9c1;
                auVar116._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar116._12_4_ = 0x3d2aa9c1;
                auVar116._16_4_ = 0x3d2aa9c1;
                auVar116._20_4_ = 0x3d2aa9c1;
                auVar116._24_4_ = 0x3d2aa9c1;
                auVar116._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar116);
                auVar117._8_4_ = 0x3e2aaaaa;
                auVar117._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar117._12_4_ = 0x3e2aaaaa;
                auVar117._16_4_ = 0x3e2aaaaa;
                auVar117._20_4_ = 0x3e2aaaaa;
                auVar117._24_4_ = 0x3e2aaaaa;
                auVar117._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar117);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar304);
                auVar164._0_4_ = fVar63 + 1.0;
                auVar164._4_4_ = fVar360 + 1.0;
                auVar164._8_4_ = fVar361 + 1.0;
                auVar164._12_4_ = fVar362 + 1.0;
                auVar164._16_4_ = 0x3f800000;
                auVar164._20_4_ = 0x3f800000;
                auVar164._24_4_ = 0x3f800000;
                auVar164._28_4_ = 0x3f800000;
                auVar325 = vfmadd231ps_fma(auVar164,auVar17,ZEXT1632(auVar325));
                auVar309._0_4_ = (int)auVar305._0_4_;
                auVar309._4_4_ = (int)auVar305._4_4_;
                auVar309._8_4_ = (int)auVar305._8_4_;
                auVar309._12_4_ = (int)auVar305._12_4_;
                auVar309._16_4_ = (int)auVar305._16_4_;
                auVar309._20_4_ = (int)auVar305._20_4_;
                auVar309._24_4_ = (int)auVar305._24_4_;
                auVar309._28_4_ = (int)auVar305._28_4_;
                auVar305 = vpslld_avx2(auVar309,0x17);
                auVar339._8_4_ = 0x3f800000;
                auVar339._0_8_ = 0x3f8000003f800000;
                auVar339._12_4_ = 0x3f800000;
                auVar339._16_4_ = 0x3f800000;
                auVar339._20_4_ = 0x3f800000;
                auVar339._24_4_ = 0x3f800000;
                auVar339._28_4_ = 0x3f800000;
                auVar305 = vpaddd_avx2(auVar339,auVar305);
                auVar325 = vfmadd213ps_fma(auVar305,ZEXT1632(auVar325),auVar310);
                auVar305 = vrcpps_avx(ZEXT1632(auVar325));
                auVar325 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar305,auVar310);
                auVar325 = vfnmadd132ps_fma(ZEXT1632(auVar325),auVar305,auVar305);
                auVar305 = ZEXT1632(auVar325);
                break;
              case 5:
                auVar355._8_4_ = 0x42b0c0a5;
                auVar355._0_8_ = 0x42b0c0a542b0c0a5;
                auVar355._12_4_ = 0x42b0c0a5;
                auVar355._16_4_ = 0x42b0c0a5;
                auVar355._20_4_ = 0x42b0c0a5;
                auVar355._24_4_ = 0x42b0c0a5;
                auVar355._28_4_ = 0x42b0c0a5;
                auVar305 = vminps_avx(auVar305,auVar355);
                auVar373._8_4_ = 0xc2b0c0a5;
                auVar373._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar373._12_4_ = 0xc2b0c0a5;
                auVar373._16_4_ = 0xc2b0c0a5;
                auVar373._20_4_ = 0xc2b0c0a5;
                auVar373._24_4_ = 0xc2b0c0a5;
                auVar373._28_4_ = 0xc2b0c0a5;
                auVar336 = vmaxps_avx(auVar373,auVar305);
                auVar378._8_4_ = 0x3fb8aa3b;
                auVar378._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar378._12_4_ = 0x3fb8aa3b;
                auVar378._16_4_ = 0x3fb8aa3b;
                auVar378._20_4_ = 0x3fb8aa3b;
                auVar378._24_4_ = 0x3fb8aa3b;
                auVar378._28_4_ = 0x3fb8aa3b;
                auVar325 = vfmadd213ps_fma(auVar378,auVar336,auVar304);
                auVar335 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar305 = vcmpps_avx(ZEXT1632(auVar325),auVar335,1);
                auVar305 = vandps_avx(auVar305,auVar310);
                auVar305 = vsubps_avx(auVar335,auVar305);
                auVar356._8_4_ = 0x3f317218;
                auVar356._0_8_ = 0x3f3172183f317218;
                auVar356._12_4_ = 0x3f317218;
                auVar356._16_4_ = 0x3f317218;
                auVar356._20_4_ = 0x3f317218;
                auVar356._24_4_ = 0x3f317218;
                auVar356._28_4_ = 0x3f317218;
                auVar320 = vfnmadd231ps_fma(auVar336,auVar305,auVar356);
                auVar336 = ZEXT1632(auVar320);
                fVar63 = auVar320._0_4_;
                fVar360 = auVar320._4_4_;
                fVar361 = auVar320._8_4_;
                fVar362 = auVar320._12_4_;
                auVar13._28_4_ = auVar335._28_4_;
                auVar13._0_28_ =
                     ZEXT1628(CONCAT412(fVar362 * fVar362,
                                        CONCAT48(fVar361 * fVar361,
                                                 CONCAT44(fVar360 * fVar360,fVar63 * fVar63))));
                auVar393._8_4_ = 0x39506967;
                auVar393._0_8_ = 0x3950696739506967;
                auVar393._12_4_ = 0x39506967;
                auVar393._16_4_ = 0x39506967;
                auVar393._20_4_ = 0x39506967;
                auVar393._24_4_ = 0x39506967;
                auVar393._28_4_ = 0x39506967;
                auVar385._8_4_ = 0x3ab743ce;
                auVar385._0_8_ = 0x3ab743ce3ab743ce;
                auVar385._12_4_ = 0x3ab743ce;
                auVar385._16_4_ = 0x3ab743ce;
                auVar385._20_4_ = 0x3ab743ce;
                auVar385._24_4_ = 0x3ab743ce;
                auVar385._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar393,auVar336,auVar385);
                auVar210._8_4_ = 0x3c088908;
                auVar210._0_8_ = 0x3c0889083c088908;
                auVar210._12_4_ = 0x3c088908;
                auVar210._16_4_ = 0x3c088908;
                auVar210._20_4_ = 0x3c088908;
                auVar210._24_4_ = 0x3c088908;
                auVar210._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar210);
                auVar114._8_4_ = 0x3d2aa9c1;
                auVar114._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar114._12_4_ = 0x3d2aa9c1;
                auVar114._16_4_ = 0x3d2aa9c1;
                auVar114._20_4_ = 0x3d2aa9c1;
                auVar114._24_4_ = 0x3d2aa9c1;
                auVar114._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar114);
                auVar211._8_4_ = 0x3e2aaaaa;
                auVar211._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar211._12_4_ = 0x3e2aaaaa;
                auVar211._16_4_ = 0x3e2aaaaa;
                auVar211._20_4_ = 0x3e2aaaaa;
                auVar211._24_4_ = 0x3e2aaaaa;
                auVar211._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar211);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar304);
                auVar236._0_4_ = fVar63 + 1.0;
                auVar236._4_4_ = fVar360 + 1.0;
                auVar236._8_4_ = fVar361 + 1.0;
                auVar236._12_4_ = fVar362 + 1.0;
                auVar236._16_4_ = 0x3f800000;
                auVar236._20_4_ = 0x3f800000;
                auVar236._24_4_ = 0x3f800000;
                auVar236._28_4_ = 0x3f800000;
                auVar325 = vfmadd231ps_fma(auVar236,auVar13,ZEXT1632(auVar325));
                auVar160._0_4_ = (int)auVar305._0_4_;
                auVar160._4_4_ = (int)auVar305._4_4_;
                auVar160._8_4_ = (int)auVar305._8_4_;
                auVar160._12_4_ = (int)auVar305._12_4_;
                auVar160._16_4_ = (int)auVar305._16_4_;
                auVar160._20_4_ = (int)auVar305._20_4_;
                auVar160._24_4_ = (int)auVar305._24_4_;
                auVar160._28_4_ = (int)auVar305._28_4_;
                auVar305 = vpslld_avx2(auVar160,0x17);
                auVar161._8_4_ = 0x3f800000;
                auVar161._0_8_ = 0x3f8000003f800000;
                auVar161._12_4_ = 0x3f800000;
                auVar161._16_4_ = 0x3f800000;
                auVar161._20_4_ = 0x3f800000;
                auVar161._24_4_ = 0x3f800000;
                auVar161._28_4_ = 0x3f800000;
                auVar305 = vpaddd_avx2(auVar305,auVar161);
                auVar325 = vfmadd213ps_fma(auVar305,ZEXT1632(auVar325),auVar310);
                auVar237._8_4_ = 0x800000;
                auVar237._0_8_ = 0x80000000800000;
                auVar237._12_4_ = 0x800000;
                auVar237._16_4_ = 0x800000;
                auVar237._20_4_ = 0x800000;
                auVar237._24_4_ = 0x800000;
                auVar237._28_4_ = 0x800000;
                auVar305 = vmaxps_avx(ZEXT1632(auVar325),auVar237);
                auVar336 = vpsrld_avx2(auVar305,0x17);
                auVar448._8_4_ = 0x807fffff;
                auVar448._0_8_ = 0x807fffff807fffff;
                auVar448._12_4_ = 0x807fffff;
                auVar448._16_4_ = 0x807fffff;
                auVar448._20_4_ = 0x807fffff;
                auVar448._24_4_ = 0x807fffff;
                auVar448._28_4_ = 0x807fffff;
                auVar305 = vandps_avx(auVar448,auVar305);
                auVar449._8_4_ = 0x3f000000;
                auVar449._0_8_ = 0x3f0000003f000000;
                auVar449._12_4_ = 0x3f000000;
                auVar449._16_4_ = 0x3f000000;
                auVar449._20_4_ = 0x3f000000;
                auVar449._24_4_ = 0x3f000000;
                auVar449._28_4_ = 0x3f000000;
                auVar335 = vorps_avx(auVar449,auVar305);
                auVar450._8_4_ = 0xffffff82;
                auVar450._0_8_ = 0xffffff82ffffff82;
                auVar450._12_4_ = 0xffffff82;
                auVar450._16_4_ = 0xffffff82;
                auVar450._20_4_ = 0xffffff82;
                auVar450._24_4_ = 0xffffff82;
                auVar450._28_4_ = 0xffffff82;
                auVar354 = vpaddd_avx2(auVar336,auVar450);
                auVar272._8_4_ = 0x3f3504f3;
                auVar272._0_8_ = 0x3f3504f33f3504f3;
                auVar272._12_4_ = 0x3f3504f3;
                auVar272._16_4_ = 0x3f3504f3;
                auVar272._20_4_ = 0x3f3504f3;
                auVar272._24_4_ = 0x3f3504f3;
                auVar272._28_4_ = 0x3f3504f3;
                auVar336 = vcmpps_avx(auVar335,auVar272,1);
                auVar305 = vandps_avx(auVar336,auVar335);
                auVar115._8_4_ = 0xbf800000;
                auVar115._0_8_ = 0xbf800000bf800000;
                auVar115._12_4_ = 0xbf800000;
                auVar115._16_4_ = 0xbf800000;
                auVar115._20_4_ = 0xbf800000;
                auVar115._24_4_ = 0xbf800000;
                auVar115._28_4_ = 0xbf800000;
                auVar238._0_4_ = auVar335._0_4_ + -1.0 + auVar305._0_4_;
                auVar238._4_4_ = auVar335._4_4_ + -1.0 + auVar305._4_4_;
                auVar238._8_4_ = auVar335._8_4_ + -1.0 + auVar305._8_4_;
                auVar238._12_4_ = auVar335._12_4_ + -1.0 + auVar305._12_4_;
                auVar238._16_4_ = auVar335._16_4_ + -1.0 + auVar305._16_4_;
                auVar238._20_4_ = auVar335._20_4_ + -1.0 + auVar305._20_4_;
                auVar238._24_4_ = auVar335._24_4_ + -1.0 + auVar305._24_4_;
                auVar238._28_4_ = auVar335._28_4_ + -1.0 + auVar305._28_4_;
                auVar335 = vcmpps_avx(ZEXT1632(auVar325),_DAT_00314f00,2);
                auVar354 = vcvtdq2ps_avx(auVar354);
                auVar305 = vandps_avx(auVar336,auVar310);
                auVar305 = vsubps_avx(auVar354,auVar305);
                auVar337._8_4_ = 0x3d9021bb;
                auVar337._0_8_ = 0x3d9021bb3d9021bb;
                auVar337._12_4_ = 0x3d9021bb;
                auVar337._16_4_ = 0x3d9021bb;
                auVar337._20_4_ = 0x3d9021bb;
                auVar337._24_4_ = 0x3d9021bb;
                auVar337._28_4_ = 0x3d9021bb;
                auVar451._8_4_ = 0xbdebd1b8;
                auVar451._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar451._12_4_ = 0xbdebd1b8;
                auVar451._16_4_ = 0xbdebd1b8;
                auVar451._20_4_ = 0xbdebd1b8;
                auVar451._24_4_ = 0xbdebd1b8;
                auVar451._28_4_ = 0xbdebd1b8;
                auVar325 = vfmadd213ps_fma(auVar337,auVar238,auVar451);
                auVar452._8_4_ = 0x3def251a;
                auVar452._0_8_ = 0x3def251a3def251a;
                auVar452._12_4_ = 0x3def251a;
                auVar452._16_4_ = 0x3def251a;
                auVar452._20_4_ = 0x3def251a;
                auVar452._24_4_ = 0x3def251a;
                auVar452._28_4_ = 0x3def251a;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar452);
                auVar453._8_4_ = 0xbdfe5d4f;
                auVar453._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar453._12_4_ = 0xbdfe5d4f;
                auVar453._16_4_ = 0xbdfe5d4f;
                auVar453._20_4_ = 0xbdfe5d4f;
                auVar453._24_4_ = 0xbdfe5d4f;
                auVar453._28_4_ = 0xbdfe5d4f;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar453);
                auVar454._8_4_ = 0x3e11e9bf;
                auVar454._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar454._12_4_ = 0x3e11e9bf;
                auVar454._16_4_ = 0x3e11e9bf;
                auVar454._20_4_ = 0x3e11e9bf;
                auVar454._24_4_ = 0x3e11e9bf;
                auVar454._28_4_ = 0x3e11e9bf;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar454);
                auVar455._8_4_ = 0xbe2aae50;
                auVar455._0_8_ = 0xbe2aae50be2aae50;
                auVar455._12_4_ = 0xbe2aae50;
                auVar455._16_4_ = 0xbe2aae50;
                auVar455._20_4_ = 0xbe2aae50;
                auVar455._24_4_ = 0xbe2aae50;
                auVar455._28_4_ = 0xbe2aae50;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar455);
                auVar456._8_4_ = 0x3e4cceac;
                auVar456._0_8_ = 0x3e4cceac3e4cceac;
                auVar456._12_4_ = 0x3e4cceac;
                auVar456._16_4_ = 0x3e4cceac;
                auVar456._20_4_ = 0x3e4cceac;
                auVar456._24_4_ = 0x3e4cceac;
                auVar456._28_4_ = 0x3e4cceac;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar456);
                auVar457._8_4_ = 0xbe7ffffc;
                auVar457._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar457._12_4_ = 0xbe7ffffc;
                auVar457._16_4_ = 0xbe7ffffc;
                auVar457._20_4_ = 0xbe7ffffc;
                auVar457._24_4_ = 0xbe7ffffc;
                auVar457._28_4_ = 0xbe7ffffc;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar457);
                auVar458._8_4_ = 0x3eaaaaaa;
                auVar458._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar458._12_4_ = 0x3eaaaaaa;
                auVar458._16_4_ = 0x3eaaaaaa;
                auVar458._20_4_ = 0x3eaaaaaa;
                auVar458._24_4_ = 0x3eaaaaaa;
                auVar458._28_4_ = 0x3eaaaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar238,auVar458);
                auVar320 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar238,auVar304);
                auVar325 = vfmadd213ps_fma(auVar305,auVar356,auVar238);
                auVar14._4_4_ = auVar238._4_4_ * auVar238._4_4_;
                auVar14._0_4_ = auVar238._0_4_ * auVar238._0_4_;
                auVar14._8_4_ = auVar238._8_4_ * auVar238._8_4_;
                auVar14._12_4_ = auVar238._12_4_ * auVar238._12_4_;
                auVar14._16_4_ = auVar238._16_4_ * auVar238._16_4_;
                auVar14._20_4_ = auVar238._20_4_ * auVar238._20_4_;
                auVar14._24_4_ = auVar238._24_4_ * auVar238._24_4_;
                auVar14._28_4_ = auVar238._28_4_;
                auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar14,ZEXT1632(auVar320));
                auVar459._8_4_ = 0xc0000000;
                auVar459._0_8_ = 0xc0000000c0000000;
                auVar459._12_4_ = 0xc0000000;
                auVar459._16_4_ = 0xc0000000;
                auVar459._20_4_ = 0xc0000000;
                auVar459._24_4_ = 0xc0000000;
                auVar459._28_4_ = 0xc0000000;
                auVar15._4_4_ = auVar325._4_4_ * -2.0;
                auVar15._0_4_ = auVar325._0_4_ * -2.0;
                auVar15._8_4_ = auVar325._8_4_ * -2.0;
                auVar15._12_4_ = auVar325._12_4_ * -2.0;
                auVar15._16_4_ = 0x80000000;
                auVar15._20_4_ = 0x80000000;
                auVar15._24_4_ = 0x80000000;
                auVar15._28_4_ = auVar238._28_4_;
                auVar306._8_4_ = 0x7fffffff;
                auVar306._0_8_ = 0x7fffffff7fffffff;
                auVar306._12_4_ = 0x7fffffff;
                auVar306._16_4_ = 0x7fffffff;
                auVar306._20_4_ = 0x7fffffff;
                auVar306._24_4_ = 0x7fffffff;
                auVar306._28_4_ = 0x7fffffff;
                auVar305 = vblendvps_avx(auVar15,auVar306,auVar335);
                auVar273._8_4_ = 0x42b0c0a5;
                auVar273._0_8_ = 0x42b0c0a542b0c0a5;
                auVar273._12_4_ = 0x42b0c0a5;
                auVar273._16_4_ = 0x42b0c0a5;
                auVar273._20_4_ = 0x42b0c0a5;
                auVar273._24_4_ = 0x42b0c0a5;
                auVar273._28_4_ = 0x42b0c0a5;
                auVar305 = vminps_avx(auVar305,auVar273);
                auVar336 = vmaxps_avx(auVar373,auVar305);
                auVar381 = ZEXT864(0) << 0x20;
                auVar325 = vfmadd213ps_fma(auVar378,auVar336,auVar304);
                auVar335 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar305 = vcmpps_avx(ZEXT1632(auVar325),auVar335,1);
                auVar305 = vandps_avx(auVar305,auVar310);
                auVar305 = vsubps_avx(auVar335,auVar305);
                auVar320 = vfnmadd231ps_fma(auVar336,auVar305,auVar356);
                auVar336 = ZEXT1632(auVar320);
                fVar63 = auVar320._0_4_;
                fVar360 = auVar320._4_4_;
                fVar361 = auVar320._8_4_;
                fVar362 = auVar320._12_4_;
                auVar16._28_4_ = auVar335._28_4_;
                auVar16._0_28_ =
                     ZEXT1628(CONCAT412(fVar362 * fVar362,
                                        CONCAT48(fVar361 * fVar361,
                                                 CONCAT44(fVar360 * fVar360,fVar63 * fVar63))));
                auVar325 = vfmadd213ps_fma(auVar393,auVar336,auVar385);
                auVar389 = ZEXT3264(auVar304);
                auVar286._8_4_ = 0x3c088908;
                auVar286._0_8_ = 0x3c0889083c088908;
                auVar286._12_4_ = 0x3c088908;
                auVar286._16_4_ = 0x3c088908;
                auVar286._20_4_ = 0x3c088908;
                auVar286._24_4_ = 0x3c088908;
                auVar286._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar286);
                auVar287._8_4_ = 0x3d2aa9c1;
                auVar287._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar287._12_4_ = 0x3d2aa9c1;
                auVar287._16_4_ = 0x3d2aa9c1;
                auVar287._20_4_ = 0x3d2aa9c1;
                auVar287._24_4_ = 0x3d2aa9c1;
                auVar287._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar287);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar211);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar304);
                auVar239._0_4_ = fVar63 + 1.0;
                auVar239._4_4_ = fVar360 + 1.0;
                auVar239._8_4_ = fVar361 + 1.0;
                auVar239._12_4_ = fVar362 + 1.0;
                auVar239._16_4_ = 0x3f800000;
                auVar239._20_4_ = 0x3f800000;
                auVar239._24_4_ = 0x3f800000;
                auVar239._28_4_ = 0x3f800000;
                auVar325 = vfmadd231ps_fma(auVar239,auVar16,ZEXT1632(auVar325));
                auVar274._0_4_ = (int)auVar305._0_4_;
                auVar274._4_4_ = (int)auVar305._4_4_;
                auVar274._8_4_ = (int)auVar305._8_4_;
                auVar274._12_4_ = (int)auVar305._12_4_;
                auVar274._16_4_ = (int)auVar305._16_4_;
                auVar274._20_4_ = (int)auVar305._20_4_;
                auVar274._24_4_ = (int)auVar305._24_4_;
                auVar274._28_4_ = (int)auVar305._28_4_;
                auVar305 = vpslld_avx2(auVar274,0x17);
                auVar305 = vpaddd_avx2(auVar305,auVar161);
                auVar325 = vfmadd213ps_fma(auVar305,ZEXT1632(auVar325),auVar310);
                auVar305 = vrcpps_avx(ZEXT1632(auVar325));
                auVar325 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar305,auVar310);
                auVar325 = vfnmadd132ps_fma(ZEXT1632(auVar325),auVar305,auVar305);
                auVar325 = vfnmadd213ps_fma(ZEXT1632(auVar325),auVar459,auVar115);
                auVar159 = ZEXT1628(auVar325);
                goto LAB_003042dd;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar165._4_4_ = uVar1;
                auVar165._0_4_ = uVar1;
                auVar165._8_4_ = uVar1;
                auVar165._12_4_ = uVar1;
                auVar165._16_4_ = uVar1;
                auVar165._20_4_ = uVar1;
                auVar165._24_4_ = uVar1;
                auVar165._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar244._4_4_ = uVar1;
                auVar244._0_4_ = uVar1;
                auVar244._8_4_ = uVar1;
                auVar244._12_4_ = uVar1;
                auVar244._16_4_ = uVar1;
                auVar244._20_4_ = uVar1;
                auVar244._24_4_ = uVar1;
                auVar244._28_4_ = uVar1;
                auVar325 = vfmadd231ps_fma(auVar244,auVar305,auVar165);
                auVar305 = vmaxps_avx(auVar336,ZEXT1632(auVar325));
                auVar305 = vminps_avx(auVar305,auVar310);
                auVar159 = auVar305._0_28_;
LAB_003042dd:
                auVar179._0_4_ = auVar428._0_4_ * auVar159._0_4_;
                auVar179._4_4_ = auVar428._4_4_ * auVar159._4_4_;
                auVar179._8_4_ = auVar428._8_4_ * auVar159._8_4_;
                auVar179._12_4_ = auVar428._12_4_ * auVar159._12_4_;
                auVar179._16_4_ = auVar428._16_4_ * auVar159._16_4_;
                auVar179._20_4_ = auVar428._20_4_ * auVar159._20_4_;
                auVar179._24_4_ = auVar428._24_4_ * auVar159._24_4_;
                auVar305 = auVar179._0_32_;
              }
              *pauVar43 = auVar305;
              pauVar43 = pauVar43 + 1;
              iVar52 = iVar52 + 8;
              bVar59 = iVar37 != iVar3;
              iVar37 = iVar37 + 1;
            } while (bVar59);
          }
          local_160 = local_160 + 1;
        } while (local_160 != uVar32);
      }
      if (iVar2 == 1 && (bVar60 && bVar58)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        uVar49 = 0;
        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar428 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar179 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar281._8_4_ = 0x3f000000;
        auVar281._0_8_ = 0x3f0000003f000000;
        auVar281._12_4_ = 0x3f000000;
        auVar281._16_4_ = 0x3f000000;
        auVar281._20_4_ = 0x3f000000;
        auVar281._24_4_ = 0x3f000000;
        auVar281._28_4_ = 0x3f000000;
        auVar389 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar394._8_4_ = 0x3c088908;
        auVar394._0_8_ = 0x3c0889083c088908;
        auVar394._12_4_ = 0x3c088908;
        auVar394._16_4_ = 0x3c088908;
        auVar394._20_4_ = 0x3c088908;
        auVar394._24_4_ = 0x3c088908;
        auVar394._28_4_ = 0x3c088908;
        do {
          if (-1 < iVar3) {
            pauVar43 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar49 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar463 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar463 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar49 * 0x20))
                ;
              }
              if (0 < iVar30) {
                pauVar56 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * uVar49 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                puVar39 = (undefined4 *)
                          ((long)(_func_int ***)local_b8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar37) * 4);
                uVar47 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    puVar38 = puVar39;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      uVar1 = *puVar38;
                      auVar166._4_4_ = uVar1;
                      auVar166._0_4_ = uVar1;
                      auVar166._8_4_ = uVar1;
                      auVar166._12_4_ = uVar1;
                      auVar166._16_4_ = uVar1;
                      auVar166._20_4_ = uVar1;
                      auVar166._24_4_ = uVar1;
                      auVar166._28_4_ = uVar1;
                      auVar325 = vfmadd231ps_fma(auVar463._0_32_,auVar166,*pauVar56);
                      auVar463 = ZEXT1664(auVar325);
                      pauVar56 = pauVar56 + 1;
                      puVar38 = puVar38 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  uVar47 = uVar47 + 1;
                  puVar39 = (undefined4 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar47 != uVar54);
              }
              auVar310 = auVar463._0_32_;
              auVar305 = auVar381._0_32_;
              auVar336 = auVar389._0_32_;
              auVar335 = auVar428._0_32_;
              auVar304 = auVar179._0_32_;
              fVar63 = auVar389._0_4_;
              fVar360 = auVar389._4_4_;
              fVar361 = auVar389._8_4_;
              fVar362 = auVar389._12_4_;
              fVar221 = auVar389._16_4_;
              fVar363 = auVar389._20_4_;
              fVar364 = auVar389._24_4_;
              fVar365 = auVar389._28_4_;
              auVar464._28_36_ = auVar463._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar310 = vmaxps_avx(auVar310,auVar305);
                break;
              case 2:
                auVar336 = vmaxps_avx(auVar310,auVar305);
                auVar310 = vminps_avx(auVar310,auVar305);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar460._4_4_ = uVar1;
                auVar460._0_4_ = uVar1;
                auVar460._8_4_ = uVar1;
                auVar460._12_4_ = uVar1;
                auVar460._16_4_ = uVar1;
                auVar460._20_4_ = uVar1;
                auVar460._24_4_ = uVar1;
                auVar460._28_4_ = uVar1;
                auVar325 = vfmadd213ps_fma(auVar460,auVar310,auVar336);
                auVar310 = ZEXT1632(auVar325);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar169._4_4_ = uVar1;
                auVar169._0_4_ = uVar1;
                auVar169._8_4_ = uVar1;
                auVar169._12_4_ = uVar1;
                auVar169._16_4_ = uVar1;
                auVar169._20_4_ = uVar1;
                auVar169._24_4_ = uVar1;
                auVar169._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar312._4_4_ = uVar1;
                auVar312._0_4_ = uVar1;
                auVar312._8_4_ = uVar1;
                auVar312._12_4_ = uVar1;
                auVar312._16_4_ = uVar1;
                auVar312._20_4_ = uVar1;
                auVar312._24_4_ = uVar1;
                auVar312._28_4_ = uVar1;
                auVar310 = vmaxps_avx(auVar310,auVar169);
                auVar310 = vminps_avx(auVar310,auVar312);
                break;
              case 4:
                auVar170._0_8_ = auVar463._0_8_ ^ 0x8000000080000000;
                auVar170._8_4_ = -auVar463._8_4_;
                auVar170._12_4_ = -auVar463._12_4_;
                auVar170._16_4_ = -auVar463._16_4_;
                auVar170._20_4_ = -auVar463._20_4_;
                auVar170._24_4_ = -auVar463._24_4_;
                auVar170._28_4_ = auVar463._28_4_ ^ 0x80000000;
                auVar132._8_4_ = 0x42b0c0a5;
                auVar132._0_8_ = 0x42b0c0a542b0c0a5;
                auVar132._12_4_ = 0x42b0c0a5;
                auVar132._16_4_ = 0x42b0c0a5;
                auVar132._20_4_ = 0x42b0c0a5;
                auVar132._24_4_ = 0x42b0c0a5;
                auVar132._28_4_ = 0x42b0c0a5;
                auVar310 = vminps_avx(auVar170,auVar132);
                auVar305 = vmaxps_avx(auVar335,auVar310);
                auVar325 = vfmadd213ps_fma(auVar304,auVar305,auVar281);
                auVar304 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar310 = vcmpps_avx(ZEXT1632(auVar325),auVar304,1);
                auVar310 = vandps_avx(auVar310,auVar336);
                auVar310 = vsubps_avx(auVar304,auVar310);
                auVar248._8_4_ = 0xbf317218;
                auVar248._0_8_ = 0xbf317218bf317218;
                auVar248._12_4_ = 0xbf317218;
                auVar248._16_4_ = 0xbf317218;
                auVar248._20_4_ = 0xbf317218;
                auVar248._24_4_ = 0xbf317218;
                auVar248._28_4_ = 0xbf317218;
                auVar320 = vfmadd231ps_fma(auVar305,auVar310,auVar248);
                auVar305 = ZEXT1632(auVar320);
                fVar9 = auVar320._0_4_;
                fVar10 = auVar320._4_4_;
                fVar11 = auVar320._8_4_;
                fVar12 = auVar320._12_4_;
                auVar22._28_4_ = auVar304._28_4_;
                auVar22._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar11 * fVar11,
                                                 CONCAT44(fVar10 * fVar10,fVar9 * fVar9))));
                auVar341._8_4_ = 0x39506967;
                auVar341._0_8_ = 0x3950696739506967;
                auVar341._12_4_ = 0x39506967;
                auVar341._16_4_ = 0x39506967;
                auVar341._20_4_ = 0x39506967;
                auVar341._24_4_ = 0x39506967;
                auVar341._28_4_ = 0x39506967;
                auVar215._8_4_ = 0x3ab743ce;
                auVar215._0_8_ = 0x3ab743ce3ab743ce;
                auVar215._12_4_ = 0x3ab743ce;
                auVar215._16_4_ = 0x3ab743ce;
                auVar215._20_4_ = 0x3ab743ce;
                auVar215._24_4_ = 0x3ab743ce;
                auVar215._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar341,auVar305,auVar215);
                auVar216._8_4_ = 0x3c088908;
                auVar216._0_8_ = 0x3c0889083c088908;
                auVar216._12_4_ = 0x3c088908;
                auVar216._16_4_ = 0x3c088908;
                auVar216._20_4_ = 0x3c088908;
                auVar216._24_4_ = 0x3c088908;
                auVar216._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar305,auVar216);
                auVar133._8_4_ = 0x3d2aa9c1;
                auVar133._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar133._12_4_ = 0x3d2aa9c1;
                auVar133._16_4_ = 0x3d2aa9c1;
                auVar133._20_4_ = 0x3d2aa9c1;
                auVar133._24_4_ = 0x3d2aa9c1;
                auVar133._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar305,auVar133);
                auVar134._8_4_ = 0x3e2aaaaa;
                auVar134._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar134._12_4_ = 0x3e2aaaaa;
                auVar134._16_4_ = 0x3e2aaaaa;
                auVar134._20_4_ = 0x3e2aaaaa;
                auVar134._24_4_ = 0x3e2aaaaa;
                auVar134._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar134);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar281);
                auVar171._0_4_ = fVar9 + fVar63;
                auVar171._4_4_ = fVar10 + fVar360;
                auVar171._8_4_ = fVar11 + fVar361;
                auVar171._12_4_ = fVar12 + fVar362;
                auVar171._16_4_ = fVar221 + 0.0;
                auVar171._20_4_ = fVar363 + 0.0;
                auVar171._24_4_ = fVar364 + 0.0;
                auVar171._28_4_ = fVar365 + 0.0;
                auVar325 = vfmadd231ps_fma(auVar171,auVar22,ZEXT1632(auVar325));
                auVar313._0_4_ = (int)auVar310._0_4_;
                auVar313._4_4_ = (int)auVar310._4_4_;
                auVar313._8_4_ = (int)auVar310._8_4_;
                auVar313._12_4_ = (int)auVar310._12_4_;
                auVar313._16_4_ = (int)auVar310._16_4_;
                auVar313._20_4_ = (int)auVar310._20_4_;
                auVar313._24_4_ = (int)auVar310._24_4_;
                auVar313._28_4_ = (int)auVar310._28_4_;
                auVar310 = vpslld_avx2(auVar313,0x17);
                auVar342._8_4_ = 0x3f800000;
                auVar342._0_8_ = 0x3f8000003f800000;
                auVar342._12_4_ = 0x3f800000;
                auVar342._16_4_ = 0x3f800000;
                auVar342._20_4_ = 0x3f800000;
                auVar342._24_4_ = 0x3f800000;
                auVar342._28_4_ = 0x3f800000;
                auVar310 = vpaddd_avx2(auVar342,auVar310);
                auVar325 = vfmadd213ps_fma(auVar310,ZEXT1632(auVar325),auVar336);
                auVar310 = vrcpps_avx(ZEXT1632(auVar325));
                auVar325 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar310,auVar336);
                auVar325 = vfnmadd132ps_fma(ZEXT1632(auVar325),auVar310,auVar310);
                auVar310 = ZEXT1632(auVar325);
                break;
              case 5:
                auVar118._8_4_ = 0x42b0c0a5;
                auVar118._0_8_ = 0x42b0c0a542b0c0a5;
                auVar118._12_4_ = 0x42b0c0a5;
                auVar118._16_4_ = 0x42b0c0a5;
                auVar118._20_4_ = 0x42b0c0a5;
                auVar118._24_4_ = 0x42b0c0a5;
                auVar118._28_4_ = 0x42b0c0a5;
                auVar310 = vminps_avx(auVar310,auVar118);
                auVar305 = vmaxps_avx(auVar335,auVar310);
                auVar325 = vfmadd213ps_fma(auVar304,auVar305,auVar281);
                auVar354 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar310 = vcmpps_avx(ZEXT1632(auVar325),auVar354,1);
                auVar310 = vandps_avx(auVar310,auVar336);
                auVar310 = vsubps_avx(auVar354,auVar310);
                auVar288._8_4_ = 0x3f317218;
                auVar288._0_8_ = 0x3f3172183f317218;
                auVar288._12_4_ = 0x3f317218;
                auVar288._16_4_ = 0x3f317218;
                auVar288._20_4_ = 0x3f317218;
                auVar288._24_4_ = 0x3f317218;
                auVar288._28_4_ = 0x3f317218;
                auVar320 = vfnmadd231ps_fma(auVar305,auVar310,auVar288);
                auVar305 = ZEXT1632(auVar320);
                fVar9 = auVar320._0_4_;
                fVar10 = auVar320._4_4_;
                fVar11 = auVar320._8_4_;
                fVar12 = auVar320._12_4_;
                auVar18._28_4_ = auVar354._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar11 * fVar11,
                                                 CONCAT44(fVar10 * fVar10,fVar9 * fVar9))));
                auVar386._8_4_ = 0x39506967;
                auVar386._0_8_ = 0x3950696739506967;
                auVar386._12_4_ = 0x39506967;
                auVar386._16_4_ = 0x39506967;
                auVar386._20_4_ = 0x39506967;
                auVar386._24_4_ = 0x39506967;
                auVar386._28_4_ = 0x39506967;
                auVar213._8_4_ = 0x3ab743ce;
                auVar213._0_8_ = 0x3ab743ce3ab743ce;
                auVar213._12_4_ = 0x3ab743ce;
                auVar213._16_4_ = 0x3ab743ce;
                auVar213._20_4_ = 0x3ab743ce;
                auVar213._24_4_ = 0x3ab743ce;
                auVar213._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar386,auVar305,auVar213);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar305,auVar394);
                auVar119._8_4_ = 0x3d2aa9c1;
                auVar119._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar119._12_4_ = 0x3d2aa9c1;
                auVar119._16_4_ = 0x3d2aa9c1;
                auVar119._20_4_ = 0x3d2aa9c1;
                auVar119._24_4_ = 0x3d2aa9c1;
                auVar119._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar305,auVar119);
                auVar120._8_4_ = 0x3e2aaaaa;
                auVar120._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar120._12_4_ = 0x3e2aaaaa;
                auVar120._16_4_ = 0x3e2aaaaa;
                auVar120._20_4_ = 0x3e2aaaaa;
                auVar120._24_4_ = 0x3e2aaaaa;
                auVar120._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar120);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar281);
                auVar245._0_4_ = fVar63 + fVar9;
                auVar245._4_4_ = fVar360 + fVar10;
                auVar245._8_4_ = fVar361 + fVar11;
                auVar245._12_4_ = fVar362 + fVar12;
                auVar245._16_4_ = fVar221 + 0.0;
                auVar245._20_4_ = fVar363 + 0.0;
                auVar245._24_4_ = fVar364 + 0.0;
                auVar245._28_4_ = fVar365 + 0.0;
                auVar325 = vfmadd231ps_fma(auVar245,auVar18,ZEXT1632(auVar325));
                auVar167._0_4_ = (int)auVar310._0_4_;
                auVar167._4_4_ = (int)auVar310._4_4_;
                auVar167._8_4_ = (int)auVar310._8_4_;
                auVar167._12_4_ = (int)auVar310._12_4_;
                auVar167._16_4_ = (int)auVar310._16_4_;
                auVar167._20_4_ = (int)auVar310._20_4_;
                auVar167._24_4_ = (int)auVar310._24_4_;
                auVar167._28_4_ = (int)auVar310._28_4_;
                auVar310 = vpslld_avx2(auVar167,0x17);
                auVar168._8_4_ = 0x3f800000;
                auVar168._0_8_ = 0x3f8000003f800000;
                auVar168._12_4_ = 0x3f800000;
                auVar168._16_4_ = 0x3f800000;
                auVar168._20_4_ = 0x3f800000;
                auVar168._24_4_ = 0x3f800000;
                auVar168._28_4_ = 0x3f800000;
                auVar310 = vpaddd_avx2(auVar310,auVar168);
                auVar325 = vfmadd213ps_fma(auVar310,ZEXT1632(auVar325),auVar336);
                auVar121._8_4_ = 0x800000;
                auVar121._0_8_ = 0x80000000800000;
                auVar121._12_4_ = 0x800000;
                auVar121._16_4_ = 0x800000;
                auVar121._20_4_ = 0x800000;
                auVar121._24_4_ = 0x800000;
                auVar121._28_4_ = 0x800000;
                auVar310 = vmaxps_avx(ZEXT1632(auVar325),auVar121);
                auVar305 = vpsrld_avx2(auVar310,0x17);
                auVar412._8_4_ = 0x807fffff;
                auVar412._0_8_ = 0x807fffff807fffff;
                auVar412._12_4_ = 0x807fffff;
                auVar412._16_4_ = 0x807fffff;
                auVar412._20_4_ = 0x807fffff;
                auVar412._24_4_ = 0x807fffff;
                auVar412._28_4_ = 0x807fffff;
                auVar310 = vandps_avx(auVar412,auVar310);
                auVar413._8_4_ = 0x3f000000;
                auVar413._0_8_ = 0x3f0000003f000000;
                auVar413._12_4_ = 0x3f000000;
                auVar413._16_4_ = 0x3f000000;
                auVar413._20_4_ = 0x3f000000;
                auVar413._24_4_ = 0x3f000000;
                auVar413._28_4_ = 0x3f000000;
                auVar354 = vorps_avx(auVar413,auVar310);
                auVar414._8_4_ = 0xffffff82;
                auVar414._0_8_ = 0xffffff82ffffff82;
                auVar414._12_4_ = 0xffffff82;
                auVar414._16_4_ = 0xffffff82;
                auVar414._20_4_ = 0xffffff82;
                auVar414._24_4_ = 0xffffff82;
                auVar414._28_4_ = 0xffffff82;
                auVar372 = vpaddd_avx2(auVar305,auVar414);
                auVar122._8_4_ = 0x3f3504f3;
                auVar122._0_8_ = 0x3f3504f33f3504f3;
                auVar122._12_4_ = 0x3f3504f3;
                auVar122._16_4_ = 0x3f3504f3;
                auVar122._20_4_ = 0x3f3504f3;
                auVar122._24_4_ = 0x3f3504f3;
                auVar122._28_4_ = 0x3f3504f3;
                auVar305 = vcmpps_avx(auVar354,auVar122,1);
                auVar310 = vandps_avx(auVar305,auVar354);
                auVar214._8_4_ = 0xbf800000;
                auVar214._0_8_ = 0xbf800000bf800000;
                auVar214._12_4_ = 0xbf800000;
                auVar214._16_4_ = 0xbf800000;
                auVar214._20_4_ = 0xbf800000;
                auVar214._24_4_ = 0xbf800000;
                auVar214._28_4_ = 0xbf800000;
                auVar246._0_4_ = auVar354._0_4_ + -1.0 + auVar310._0_4_;
                auVar246._4_4_ = auVar354._4_4_ + -1.0 + auVar310._4_4_;
                auVar246._8_4_ = auVar354._8_4_ + -1.0 + auVar310._8_4_;
                auVar246._12_4_ = auVar354._12_4_ + -1.0 + auVar310._12_4_;
                auVar246._16_4_ = auVar354._16_4_ + -1.0 + auVar310._16_4_;
                auVar246._20_4_ = auVar354._20_4_ + -1.0 + auVar310._20_4_;
                auVar246._24_4_ = auVar354._24_4_ + -1.0 + auVar310._24_4_;
                auVar246._28_4_ = auVar354._28_4_ + -1.0 + auVar310._28_4_;
                auVar354 = vcmpps_avx(ZEXT1632(auVar325),ZEXT832(0) << 0x20,2);
                auVar372 = vcvtdq2ps_avx(auVar372);
                auVar310 = vandps_avx(auVar305,auVar336);
                auVar428 = ZEXT3264(auVar335);
                auVar179 = ZEXT3264(auVar304);
                auVar310 = vsubps_avx(auVar372,auVar310);
                auVar340._8_4_ = 0x3d9021bb;
                auVar340._0_8_ = 0x3d9021bb3d9021bb;
                auVar340._12_4_ = 0x3d9021bb;
                auVar340._16_4_ = 0x3d9021bb;
                auVar340._20_4_ = 0x3d9021bb;
                auVar340._24_4_ = 0x3d9021bb;
                auVar340._28_4_ = 0x3d9021bb;
                auVar123._8_4_ = 0xbdebd1b8;
                auVar123._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar123._12_4_ = 0xbdebd1b8;
                auVar123._16_4_ = 0xbdebd1b8;
                auVar123._20_4_ = 0xbdebd1b8;
                auVar123._24_4_ = 0xbdebd1b8;
                auVar123._28_4_ = 0xbdebd1b8;
                auVar325 = vfmadd213ps_fma(auVar340,auVar246,auVar123);
                auVar124._8_4_ = 0x3def251a;
                auVar124._0_8_ = 0x3def251a3def251a;
                auVar124._12_4_ = 0x3def251a;
                auVar124._16_4_ = 0x3def251a;
                auVar124._20_4_ = 0x3def251a;
                auVar124._24_4_ = 0x3def251a;
                auVar124._28_4_ = 0x3def251a;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar124);
                auVar125._8_4_ = 0xbdfe5d4f;
                auVar125._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar125._12_4_ = 0xbdfe5d4f;
                auVar125._16_4_ = 0xbdfe5d4f;
                auVar125._20_4_ = 0xbdfe5d4f;
                auVar125._24_4_ = 0xbdfe5d4f;
                auVar125._28_4_ = 0xbdfe5d4f;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar125);
                auVar126._8_4_ = 0x3e11e9bf;
                auVar126._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar126._12_4_ = 0x3e11e9bf;
                auVar126._16_4_ = 0x3e11e9bf;
                auVar126._20_4_ = 0x3e11e9bf;
                auVar126._24_4_ = 0x3e11e9bf;
                auVar126._28_4_ = 0x3e11e9bf;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar126);
                auVar127._8_4_ = 0xbe2aae50;
                auVar127._0_8_ = 0xbe2aae50be2aae50;
                auVar127._12_4_ = 0xbe2aae50;
                auVar127._16_4_ = 0xbe2aae50;
                auVar127._20_4_ = 0xbe2aae50;
                auVar127._24_4_ = 0xbe2aae50;
                auVar127._28_4_ = 0xbe2aae50;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar127);
                auVar128._8_4_ = 0x3e4cceac;
                auVar128._0_8_ = 0x3e4cceac3e4cceac;
                auVar128._12_4_ = 0x3e4cceac;
                auVar128._16_4_ = 0x3e4cceac;
                auVar128._20_4_ = 0x3e4cceac;
                auVar128._24_4_ = 0x3e4cceac;
                auVar128._28_4_ = 0x3e4cceac;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar128);
                auVar129._8_4_ = 0xbe7ffffc;
                auVar129._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar129._12_4_ = 0xbe7ffffc;
                auVar129._16_4_ = 0xbe7ffffc;
                auVar129._20_4_ = 0xbe7ffffc;
                auVar129._24_4_ = 0xbe7ffffc;
                auVar129._28_4_ = 0xbe7ffffc;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar129);
                auVar130._8_4_ = 0x3eaaaaaa;
                auVar130._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar130._12_4_ = 0x3eaaaaaa;
                auVar130._16_4_ = 0x3eaaaaaa;
                auVar130._20_4_ = 0x3eaaaaaa;
                auVar130._24_4_ = 0x3eaaaaaa;
                auVar130._28_4_ = 0x3eaaaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar246,auVar130);
                auVar320 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar246,auVar281);
                auVar379._8_4_ = 0x3f317218;
                auVar379._0_8_ = 0x3f3172183f317218;
                auVar379._12_4_ = 0x3f317218;
                auVar379._16_4_ = 0x3f317218;
                auVar379._20_4_ = 0x3f317218;
                auVar379._24_4_ = 0x3f317218;
                auVar379._28_4_ = 0x3f317218;
                auVar325 = vfmadd213ps_fma(auVar310,auVar379,auVar246);
                auVar19._4_4_ = auVar246._4_4_ * auVar246._4_4_;
                auVar19._0_4_ = auVar246._0_4_ * auVar246._0_4_;
                auVar19._8_4_ = auVar246._8_4_ * auVar246._8_4_;
                auVar19._12_4_ = auVar246._12_4_ * auVar246._12_4_;
                auVar19._16_4_ = auVar246._16_4_ * auVar246._16_4_;
                auVar19._20_4_ = auVar246._20_4_ * auVar246._20_4_;
                auVar19._24_4_ = auVar246._24_4_ * auVar246._24_4_;
                auVar19._28_4_ = auVar246._28_4_;
                auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar19,ZEXT1632(auVar320));
                auVar131._8_4_ = 0xc0000000;
                auVar131._0_8_ = 0xc0000000c0000000;
                auVar131._12_4_ = 0xc0000000;
                auVar131._16_4_ = 0xc0000000;
                auVar131._20_4_ = 0xc0000000;
                auVar131._24_4_ = 0xc0000000;
                auVar131._28_4_ = 0xc0000000;
                auVar20._4_4_ = auVar325._4_4_ * -2.0;
                auVar20._0_4_ = auVar325._0_4_ * -2.0;
                auVar20._8_4_ = auVar325._8_4_ * -2.0;
                auVar20._12_4_ = auVar325._12_4_ * -2.0;
                auVar20._16_4_ = 0x80000000;
                auVar20._20_4_ = 0x80000000;
                auVar20._24_4_ = 0x80000000;
                auVar20._28_4_ = auVar246._28_4_;
                auVar311._8_4_ = 0x7fffffff;
                auVar311._0_8_ = 0x7fffffff7fffffff;
                auVar311._12_4_ = 0x7fffffff;
                auVar311._16_4_ = 0x7fffffff;
                auVar311._20_4_ = 0x7fffffff;
                auVar311._24_4_ = 0x7fffffff;
                auVar311._28_4_ = 0x7fffffff;
                auVar310 = vblendvps_avx(auVar20,auVar311,auVar354);
                auVar310 = vminps_avx(auVar310,auVar118);
                auVar305 = vmaxps_avx(auVar335,auVar310);
                auVar325 = vfmadd213ps_fma(auVar304,auVar305,auVar281);
                auVar304 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar310 = vcmpps_avx(ZEXT1632(auVar325),auVar304,1);
                auVar310 = vandps_avx(auVar336,auVar310);
                auVar310 = vsubps_avx(auVar304,auVar310);
                auVar320 = vfnmadd231ps_fma(auVar305,auVar310,auVar379);
                auVar389 = ZEXT3264(auVar336);
                auVar305 = ZEXT1632(auVar320);
                fVar9 = auVar320._0_4_;
                fVar10 = auVar320._4_4_;
                fVar11 = auVar320._8_4_;
                fVar12 = auVar320._12_4_;
                auVar21._28_4_ = auVar304._28_4_;
                auVar21._0_28_ =
                     ZEXT1628(CONCAT412(fVar12 * fVar12,
                                        CONCAT48(fVar11 * fVar11,
                                                 CONCAT44(fVar10 * fVar10,fVar9 * fVar9))));
                auVar357._8_4_ = 0x3ab743ce;
                auVar357._0_8_ = 0x3ab743ce3ab743ce;
                auVar357._12_4_ = 0x3ab743ce;
                auVar357._16_4_ = 0x3ab743ce;
                auVar357._20_4_ = 0x3ab743ce;
                auVar357._24_4_ = 0x3ab743ce;
                auVar357._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar386,auVar305,auVar357);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar305,auVar394);
                auVar358._8_4_ = 0x3d2aa9c1;
                auVar358._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar358._12_4_ = 0x3d2aa9c1;
                auVar358._16_4_ = 0x3d2aa9c1;
                auVar358._20_4_ = 0x3d2aa9c1;
                auVar358._24_4_ = 0x3d2aa9c1;
                auVar358._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar305,auVar358);
                auVar359._8_4_ = 0x3e2aaaaa;
                auVar359._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar359._12_4_ = 0x3e2aaaaa;
                auVar359._16_4_ = 0x3e2aaaaa;
                auVar359._20_4_ = 0x3e2aaaaa;
                auVar359._24_4_ = 0x3e2aaaaa;
                auVar359._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar359);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar281);
                auVar247._0_4_ = fVar9 + fVar63;
                auVar247._4_4_ = fVar10 + fVar360;
                auVar247._8_4_ = fVar11 + fVar361;
                auVar247._12_4_ = fVar12 + fVar362;
                auVar247._16_4_ = fVar221 + 0.0;
                auVar247._20_4_ = fVar363 + 0.0;
                auVar247._24_4_ = fVar364 + 0.0;
                auVar247._28_4_ = fVar365 + 0.0;
                auVar325 = vfmadd231ps_fma(auVar247,auVar21,ZEXT1632(auVar325));
                auVar275._0_4_ = (int)auVar310._0_4_;
                auVar275._4_4_ = (int)auVar310._4_4_;
                auVar275._8_4_ = (int)auVar310._8_4_;
                auVar275._12_4_ = (int)auVar310._12_4_;
                auVar275._16_4_ = (int)auVar310._16_4_;
                auVar275._20_4_ = (int)auVar310._20_4_;
                auVar275._24_4_ = (int)auVar310._24_4_;
                auVar275._28_4_ = (int)auVar310._28_4_;
                auVar310 = vpslld_avx2(auVar275,0x17);
                auVar310 = vpaddd_avx2(auVar310,auVar168);
                auVar381 = ZEXT1664((undefined1  [16])0x0);
                auVar325 = vfmadd213ps_fma(auVar310,ZEXT1632(auVar325),auVar336);
                auVar310 = vrcpps_avx(ZEXT1632(auVar325));
                auVar325 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar310,auVar336);
                auVar325 = vfnmadd132ps_fma(ZEXT1632(auVar325),auVar310,auVar310);
                auVar325 = vfnmadd213ps_fma(ZEXT1632(auVar325),auVar131,auVar214);
                auVar159 = ZEXT1628(auVar325);
                goto LAB_00304845;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar172._4_4_ = uVar1;
                auVar172._0_4_ = uVar1;
                auVar172._8_4_ = uVar1;
                auVar172._12_4_ = uVar1;
                auVar172._16_4_ = uVar1;
                auVar172._20_4_ = uVar1;
                auVar172._24_4_ = uVar1;
                auVar172._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar249._4_4_ = uVar1;
                auVar249._0_4_ = uVar1;
                auVar249._8_4_ = uVar1;
                auVar249._12_4_ = uVar1;
                auVar249._16_4_ = uVar1;
                auVar249._20_4_ = uVar1;
                auVar249._24_4_ = uVar1;
                auVar249._28_4_ = uVar1;
                auVar325 = vfmadd231ps_fma(auVar249,auVar310,auVar172);
                auVar310 = vmaxps_avx(ZEXT1632(auVar325),auVar305);
                auVar310 = vminps_avx(auVar310,auVar336);
                auVar159 = auVar310._0_28_;
LAB_00304845:
                auVar464._0_4_ = auVar463._0_4_ * auVar159._0_4_;
                auVar464._4_4_ = auVar463._4_4_ * auVar159._4_4_;
                auVar464._8_4_ = auVar463._8_4_ * auVar159._8_4_;
                auVar464._12_4_ = auVar463._12_4_ * auVar159._12_4_;
                auVar464._16_4_ = auVar463._16_4_ * auVar159._16_4_;
                auVar464._20_4_ = auVar463._20_4_ * auVar159._20_4_;
                auVar464._24_4_ = auVar463._24_4_ * auVar159._24_4_;
                auVar310 = auVar464._0_32_;
              }
              *pauVar43 = auVar310;
              pauVar43 = pauVar43 + 1;
              bVar59 = iVar37 != iVar3;
              iVar37 = iVar37 + 1;
            } while (bVar59);
          }
          uVar49 = uVar49 + 1;
        } while (uVar49 != uVar32);
      }
      if ((bVar60 && bVar58) && iVar2 == 4) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_160 = 0;
        auVar381 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar282._8_4_ = 0x3f000000;
        auVar282._0_8_ = 0x3f0000003f000000;
        auVar282._12_4_ = 0x3f000000;
        auVar282._16_4_ = 0x3f000000;
        auVar282._20_4_ = 0x3f000000;
        auVar282._24_4_ = 0x3f000000;
        auVar282._28_4_ = 0x3f000000;
        auVar289._8_4_ = 0x3f800000;
        auVar289._0_8_ = 0x3f8000003f800000;
        auVar289._12_4_ = 0x3f800000;
        auVar289._16_4_ = 0x3f800000;
        auVar289._20_4_ = 0x3f800000;
        auVar289._24_4_ = 0x3f800000;
        auVar289._28_4_ = 0x3f800000;
        auVar374._8_4_ = 0xc2b0c0a5;
        auVar374._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar374._12_4_ = 0xc2b0c0a5;
        auVar374._16_4_ = 0xc2b0c0a5;
        auVar374._20_4_ = 0xc2b0c0a5;
        auVar374._24_4_ = 0xc2b0c0a5;
        auVar374._28_4_ = 0xc2b0c0a5;
        auVar395._8_4_ = 0x3d2aa9c1;
        auVar395._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar395._12_4_ = 0x3d2aa9c1;
        auVar395._16_4_ = 0x3d2aa9c1;
        auVar395._20_4_ = 0x3d2aa9c1;
        auVar395._24_4_ = 0x3d2aa9c1;
        auVar395._28_4_ = 0x3d2aa9c1;
        do {
          if (-1 < iVar3) {
            pauVar43 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar389 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar389 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_160 * 0x20));
              }
              if (iVar30 < 1) {
                auVar179 = ZEXT3264(auVar389._0_32_);
              }
              else {
                pauVar56 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_160 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                puVar39 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar52) * 4 + 4);
                uVar49 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var7) < 1) {
                    auVar179 = ZEXT3264(auVar389._0_32_);
                  }
                  else {
                    puVar38 = puVar39;
                    iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      uVar1 = puVar38[-3];
                      auVar461._4_4_ = uVar1;
                      auVar461._0_4_ = uVar1;
                      auVar461._8_4_ = uVar1;
                      auVar461._12_4_ = uVar1;
                      auVar461._16_4_ = uVar1;
                      auVar461._20_4_ = uVar1;
                      auVar461._24_4_ = uVar1;
                      auVar461._28_4_ = uVar1;
                      uVar1 = puVar38[-2];
                      auVar250._4_4_ = uVar1;
                      auVar250._0_4_ = uVar1;
                      auVar250._8_4_ = uVar1;
                      auVar250._12_4_ = uVar1;
                      auVar250._16_4_ = uVar1;
                      auVar250._20_4_ = uVar1;
                      auVar250._24_4_ = uVar1;
                      auVar250._28_4_ = uVar1;
                      uVar1 = puVar38[-1];
                      auVar276._4_4_ = uVar1;
                      auVar276._0_4_ = uVar1;
                      auVar276._8_4_ = uVar1;
                      auVar276._12_4_ = uVar1;
                      auVar276._16_4_ = uVar1;
                      auVar276._20_4_ = uVar1;
                      auVar276._24_4_ = uVar1;
                      auVar276._28_4_ = uVar1;
                      uVar1 = *puVar38;
                      auVar314._4_4_ = uVar1;
                      auVar314._0_4_ = uVar1;
                      auVar314._8_4_ = uVar1;
                      auVar314._12_4_ = uVar1;
                      auVar314._16_4_ = uVar1;
                      auVar314._20_4_ = uVar1;
                      auVar314._24_4_ = uVar1;
                      auVar314._28_4_ = uVar1;
                      auVar325 = vfmadd132ps_fma(auVar461,auVar389._0_32_,*pauVar56);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar250,pauVar56[1]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar276,pauVar56[2]);
                      auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar314,pauVar56[3]);
                      auVar179 = ZEXT1664(auVar325);
                      pauVar56 = pauVar56 + 4;
                      puVar38 = puVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      auVar389 = ZEXT1664(auVar325);
                      iVar34 = iVar34 + -1;
                    } while (iVar34 != 0);
                  }
                  uVar49 = uVar49 + 1;
                  puVar39 = (undefined4 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
                  auVar389 = ZEXT3264(auVar179._0_32_);
                } while (uVar49 != uVar54);
              }
              auVar310 = auVar179._0_32_;
              auVar305 = auVar381._0_32_;
              auVar389._28_36_ = auVar179._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar310 = vmaxps_avx(auVar310,_DAT_00314f00);
                break;
              case 2:
                auVar305 = vmaxps_avx(auVar310,ZEXT1632(ZEXT816(0) << 0x40));
                auVar310 = vminps_avx(auVar310,ZEXT1632(ZEXT816(0) << 0x40));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar462._4_4_ = uVar1;
                auVar462._0_4_ = uVar1;
                auVar462._8_4_ = uVar1;
                auVar462._12_4_ = uVar1;
                auVar462._16_4_ = uVar1;
                auVar462._20_4_ = uVar1;
                auVar462._24_4_ = uVar1;
                auVar462._28_4_ = uVar1;
                auVar325 = vfmadd213ps_fma(auVar462,auVar310,auVar305);
                auVar310 = ZEXT1632(auVar325);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar175._4_4_ = uVar1;
                auVar175._0_4_ = uVar1;
                auVar175._8_4_ = uVar1;
                auVar175._12_4_ = uVar1;
                auVar175._16_4_ = uVar1;
                auVar175._20_4_ = uVar1;
                auVar175._24_4_ = uVar1;
                auVar175._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar316._4_4_ = uVar1;
                auVar316._0_4_ = uVar1;
                auVar316._8_4_ = uVar1;
                auVar316._12_4_ = uVar1;
                auVar316._16_4_ = uVar1;
                auVar316._20_4_ = uVar1;
                auVar316._24_4_ = uVar1;
                auVar316._28_4_ = uVar1;
                auVar310 = vmaxps_avx(auVar310,auVar175);
                auVar310 = vminps_avx(auVar310,auVar316);
                break;
              case 4:
                auVar176._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
                auVar176._8_4_ = -auVar179._8_4_;
                auVar176._12_4_ = -auVar179._12_4_;
                auVar176._16_4_ = -auVar179._16_4_;
                auVar176._20_4_ = -auVar179._20_4_;
                auVar176._24_4_ = -auVar179._24_4_;
                auVar176._28_4_ = auVar179._28_4_ ^ 0x80000000;
                auVar138._8_4_ = 0x42b0c0a5;
                auVar138._0_8_ = 0x42b0c0a542b0c0a5;
                auVar138._12_4_ = 0x42b0c0a5;
                auVar138._16_4_ = 0x42b0c0a5;
                auVar138._20_4_ = 0x42b0c0a5;
                auVar138._24_4_ = 0x42b0c0a5;
                auVar138._28_4_ = 0x42b0c0a5;
                auVar310 = vminps_avx(auVar176,auVar138);
                auVar139._8_4_ = 0xc2b0c0a5;
                auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar139._12_4_ = 0xc2b0c0a5;
                auVar139._16_4_ = 0xc2b0c0a5;
                auVar139._20_4_ = 0xc2b0c0a5;
                auVar139._24_4_ = 0xc2b0c0a5;
                auVar139._28_4_ = 0xc2b0c0a5;
                auVar336 = vmaxps_avx(auVar310,auVar139);
                auVar325 = vfmadd213ps_fma(auVar305,auVar336,auVar282);
                auVar305 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar310 = vcmpps_avx(ZEXT1632(auVar325),auVar305,1);
                auVar310 = vandps_avx(auVar310,auVar289);
                auVar310 = vsubps_avx(auVar305,auVar310);
                auVar255._8_4_ = 0xbf317218;
                auVar255._0_8_ = 0xbf317218bf317218;
                auVar255._12_4_ = 0xbf317218;
                auVar255._16_4_ = 0xbf317218;
                auVar255._20_4_ = 0xbf317218;
                auVar255._24_4_ = 0xbf317218;
                auVar255._28_4_ = 0xbf317218;
                auVar320 = vfmadd231ps_fma(auVar336,auVar310,auVar255);
                auVar336 = ZEXT1632(auVar320);
                fVar63 = auVar320._0_4_;
                fVar360 = auVar320._4_4_;
                fVar361 = auVar320._8_4_;
                fVar362 = auVar320._12_4_;
                auVar27._28_4_ = auVar305._28_4_;
                auVar27._0_28_ =
                     ZEXT1628(CONCAT412(fVar362 * fVar362,
                                        CONCAT48(fVar361 * fVar361,
                                                 CONCAT44(fVar360 * fVar360,fVar63 * fVar63))));
                auVar345._8_4_ = 0x39506967;
                auVar345._0_8_ = 0x3950696739506967;
                auVar345._12_4_ = 0x39506967;
                auVar345._16_4_ = 0x39506967;
                auVar345._20_4_ = 0x39506967;
                auVar345._24_4_ = 0x39506967;
                auVar345._28_4_ = 0x39506967;
                auVar256._8_4_ = 0x3ab743ce;
                auVar256._0_8_ = 0x3ab743ce3ab743ce;
                auVar256._12_4_ = 0x3ab743ce;
                auVar256._16_4_ = 0x3ab743ce;
                auVar256._20_4_ = 0x3ab743ce;
                auVar256._24_4_ = 0x3ab743ce;
                auVar256._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar345,auVar336,auVar256);
                auVar220._8_4_ = 0x3c088908;
                auVar220._0_8_ = 0x3c0889083c088908;
                auVar220._12_4_ = 0x3c088908;
                auVar220._16_4_ = 0x3c088908;
                auVar220._20_4_ = 0x3c088908;
                auVar220._24_4_ = 0x3c088908;
                auVar220._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar220);
                auVar140._8_4_ = 0x3d2aa9c1;
                auVar140._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar140._12_4_ = 0x3d2aa9c1;
                auVar140._16_4_ = 0x3d2aa9c1;
                auVar140._20_4_ = 0x3d2aa9c1;
                auVar140._24_4_ = 0x3d2aa9c1;
                auVar140._28_4_ = 0x3d2aa9c1;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar140);
                auVar141._8_4_ = 0x3e2aaaaa;
                auVar141._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar141._12_4_ = 0x3e2aaaaa;
                auVar141._16_4_ = 0x3e2aaaaa;
                auVar141._20_4_ = 0x3e2aaaaa;
                auVar141._24_4_ = 0x3e2aaaaa;
                auVar141._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar141);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar282);
                auVar177._0_4_ = fVar63 + 1.0;
                auVar177._4_4_ = fVar360 + 1.0;
                auVar177._8_4_ = fVar361 + 1.0;
                auVar177._12_4_ = fVar362 + 1.0;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar325 = vfmadd231ps_fma(auVar177,auVar27,ZEXT1632(auVar325));
                auVar317._0_4_ = (int)auVar310._0_4_;
                auVar317._4_4_ = (int)auVar310._4_4_;
                auVar317._8_4_ = (int)auVar310._8_4_;
                auVar317._12_4_ = (int)auVar310._12_4_;
                auVar317._16_4_ = (int)auVar310._16_4_;
                auVar317._20_4_ = (int)auVar310._20_4_;
                auVar317._24_4_ = (int)auVar310._24_4_;
                auVar317._28_4_ = (int)auVar310._28_4_;
                auVar310 = vpslld_avx2(auVar317,0x17);
                auVar346._8_4_ = 0x3f800000;
                auVar346._0_8_ = 0x3f8000003f800000;
                auVar346._12_4_ = 0x3f800000;
                auVar346._16_4_ = 0x3f800000;
                auVar346._20_4_ = 0x3f800000;
                auVar346._24_4_ = 0x3f800000;
                auVar346._28_4_ = 0x3f800000;
                auVar310 = vpaddd_avx2(auVar346,auVar310);
                auVar325 = vfmadd213ps_fma(auVar310,ZEXT1632(auVar325),auVar289);
                auVar310 = vrcpps_avx(ZEXT1632(auVar325));
                auVar325 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar310,auVar289);
                auVar325 = vfnmadd132ps_fma(ZEXT1632(auVar325),auVar310,auVar310);
                auVar310 = ZEXT1632(auVar325);
                break;
              case 5:
                auVar217._8_4_ = 0x42b0c0a5;
                auVar217._0_8_ = 0x42b0c0a542b0c0a5;
                auVar217._12_4_ = 0x42b0c0a5;
                auVar217._16_4_ = 0x42b0c0a5;
                auVar217._20_4_ = 0x42b0c0a5;
                auVar217._24_4_ = 0x42b0c0a5;
                auVar217._28_4_ = 0x42b0c0a5;
                auVar310 = vminps_avx(auVar310,auVar217);
                auVar336 = vmaxps_avx(auVar374,auVar310);
                auVar325 = vfmadd213ps_fma(auVar305,auVar336,auVar282);
                auVar304 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar310 = vcmpps_avx(ZEXT1632(auVar325),auVar304,1);
                auVar310 = vandps_avx(auVar310,auVar289);
                auVar310 = vsubps_avx(auVar304,auVar310);
                auVar135._8_4_ = 0x3f317218;
                auVar135._0_8_ = 0x3f3172183f317218;
                auVar135._12_4_ = 0x3f317218;
                auVar135._16_4_ = 0x3f317218;
                auVar135._20_4_ = 0x3f317218;
                auVar135._24_4_ = 0x3f317218;
                auVar135._28_4_ = 0x3f317218;
                auVar320 = vfnmadd231ps_fma(auVar336,auVar310,auVar135);
                auVar336 = ZEXT1632(auVar320);
                fVar63 = auVar320._0_4_;
                fVar360 = auVar320._4_4_;
                fVar361 = auVar320._8_4_;
                fVar362 = auVar320._12_4_;
                auVar23._28_4_ = auVar304._28_4_;
                auVar23._0_28_ =
                     ZEXT1628(CONCAT412(fVar362 * fVar362,
                                        CONCAT48(fVar361 * fVar361,
                                                 CONCAT44(fVar360 * fVar360,fVar63 * fVar63))));
                auVar415._8_4_ = 0x39506967;
                auVar415._0_8_ = 0x3950696739506967;
                auVar415._12_4_ = 0x39506967;
                auVar415._16_4_ = 0x39506967;
                auVar415._20_4_ = 0x39506967;
                auVar415._24_4_ = 0x39506967;
                auVar415._28_4_ = 0x39506967;
                auVar387._8_4_ = 0x3ab743ce;
                auVar387._0_8_ = 0x3ab743ce3ab743ce;
                auVar387._12_4_ = 0x3ab743ce;
                auVar387._16_4_ = 0x3ab743ce;
                auVar387._20_4_ = 0x3ab743ce;
                auVar387._24_4_ = 0x3ab743ce;
                auVar387._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar415,auVar336,auVar387);
                auVar218._8_4_ = 0x3c088908;
                auVar218._0_8_ = 0x3c0889083c088908;
                auVar218._12_4_ = 0x3c088908;
                auVar218._16_4_ = 0x3c088908;
                auVar218._20_4_ = 0x3c088908;
                auVar218._24_4_ = 0x3c088908;
                auVar218._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar218);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar395);
                auVar388._8_4_ = 0x3e2aaaaa;
                auVar388._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar388._12_4_ = 0x3e2aaaaa;
                auVar388._16_4_ = 0x3e2aaaaa;
                auVar388._20_4_ = 0x3e2aaaaa;
                auVar388._24_4_ = 0x3e2aaaaa;
                auVar388._28_4_ = 0x3e2aaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar388);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar282);
                auVar251._0_4_ = fVar63 + 1.0;
                auVar251._4_4_ = fVar360 + 1.0;
                auVar251._8_4_ = fVar361 + 1.0;
                auVar251._12_4_ = fVar362 + 1.0;
                auVar251._16_4_ = 0x3f800000;
                auVar251._20_4_ = 0x3f800000;
                auVar251._24_4_ = 0x3f800000;
                auVar251._28_4_ = 0x3f800000;
                auVar325 = vfmadd231ps_fma(auVar251,auVar23,ZEXT1632(auVar325));
                auVar173._0_4_ = (int)auVar310._0_4_;
                auVar173._4_4_ = (int)auVar310._4_4_;
                auVar173._8_4_ = (int)auVar310._8_4_;
                auVar173._12_4_ = (int)auVar310._12_4_;
                auVar173._16_4_ = (int)auVar310._16_4_;
                auVar173._20_4_ = (int)auVar310._20_4_;
                auVar173._24_4_ = (int)auVar310._24_4_;
                auVar173._28_4_ = (int)auVar310._28_4_;
                auVar310 = vpslld_avx2(auVar173,0x17);
                auVar174._8_4_ = 0x3f800000;
                auVar174._0_8_ = 0x3f8000003f800000;
                auVar174._12_4_ = 0x3f800000;
                auVar174._16_4_ = 0x3f800000;
                auVar174._20_4_ = 0x3f800000;
                auVar174._24_4_ = 0x3f800000;
                auVar174._28_4_ = 0x3f800000;
                auVar310 = vpaddd_avx2(auVar310,auVar174);
                auVar325 = vfmadd213ps_fma(auVar310,ZEXT1632(auVar325),auVar289);
                auVar252._8_4_ = 0x800000;
                auVar252._0_8_ = 0x80000000800000;
                auVar252._12_4_ = 0x800000;
                auVar252._16_4_ = 0x800000;
                auVar252._20_4_ = 0x800000;
                auVar252._24_4_ = 0x800000;
                auVar252._28_4_ = 0x800000;
                auVar310 = vmaxps_avx(ZEXT1632(auVar325),auVar252);
                auVar336 = vpsrld_avx2(auVar310,0x17);
                auVar416._8_4_ = 0x807fffff;
                auVar416._0_8_ = 0x807fffff807fffff;
                auVar416._12_4_ = 0x807fffff;
                auVar416._16_4_ = 0x807fffff;
                auVar416._20_4_ = 0x807fffff;
                auVar416._24_4_ = 0x807fffff;
                auVar416._28_4_ = 0x807fffff;
                auVar310 = vandps_avx(auVar416,auVar310);
                auVar417._8_4_ = 0x3f000000;
                auVar417._0_8_ = 0x3f0000003f000000;
                auVar417._12_4_ = 0x3f000000;
                auVar417._16_4_ = 0x3f000000;
                auVar417._20_4_ = 0x3f000000;
                auVar417._24_4_ = 0x3f000000;
                auVar417._28_4_ = 0x3f000000;
                auVar304 = vorps_avx(auVar417,auVar310);
                auVar418._8_4_ = 0xffffff82;
                auVar418._0_8_ = 0xffffff82ffffff82;
                auVar418._12_4_ = 0xffffff82;
                auVar418._16_4_ = 0xffffff82;
                auVar418._20_4_ = 0xffffff82;
                auVar418._24_4_ = 0xffffff82;
                auVar418._28_4_ = 0xffffff82;
                auVar335 = vpaddd_avx2(auVar336,auVar418);
                auVar277._8_4_ = 0x3f3504f3;
                auVar277._0_8_ = 0x3f3504f33f3504f3;
                auVar277._12_4_ = 0x3f3504f3;
                auVar277._16_4_ = 0x3f3504f3;
                auVar277._20_4_ = 0x3f3504f3;
                auVar277._24_4_ = 0x3f3504f3;
                auVar277._28_4_ = 0x3f3504f3;
                auVar336 = vcmpps_avx(auVar304,auVar277,1);
                auVar310 = vandps_avx(auVar336,auVar304);
                auVar219._8_4_ = 0xbf800000;
                auVar219._0_8_ = 0xbf800000bf800000;
                auVar219._12_4_ = 0xbf800000;
                auVar219._16_4_ = 0xbf800000;
                auVar219._20_4_ = 0xbf800000;
                auVar219._24_4_ = 0xbf800000;
                auVar219._28_4_ = 0xbf800000;
                auVar253._0_4_ = auVar304._0_4_ + -1.0 + auVar310._0_4_;
                auVar253._4_4_ = auVar304._4_4_ + -1.0 + auVar310._4_4_;
                auVar253._8_4_ = auVar304._8_4_ + -1.0 + auVar310._8_4_;
                auVar253._12_4_ = auVar304._12_4_ + -1.0 + auVar310._12_4_;
                auVar253._16_4_ = auVar304._16_4_ + -1.0 + auVar310._16_4_;
                auVar253._20_4_ = auVar304._20_4_ + -1.0 + auVar310._20_4_;
                auVar253._24_4_ = auVar304._24_4_ + -1.0 + auVar310._24_4_;
                auVar253._28_4_ = auVar304._28_4_ + -1.0 + auVar310._28_4_;
                auVar304 = vcmpps_avx(ZEXT1632(auVar325),_DAT_00314f00,2);
                auVar335 = vcvtdq2ps_avx(auVar335);
                auVar310 = vandps_avx(auVar336,auVar289);
                auVar310 = vsubps_avx(auVar335,auVar310);
                auVar343._8_4_ = 0x3d9021bb;
                auVar343._0_8_ = 0x3d9021bb3d9021bb;
                auVar343._12_4_ = 0x3d9021bb;
                auVar343._16_4_ = 0x3d9021bb;
                auVar343._20_4_ = 0x3d9021bb;
                auVar343._24_4_ = 0x3d9021bb;
                auVar343._28_4_ = 0x3d9021bb;
                auVar419._8_4_ = 0xbdebd1b8;
                auVar419._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar419._12_4_ = 0xbdebd1b8;
                auVar419._16_4_ = 0xbdebd1b8;
                auVar419._20_4_ = 0xbdebd1b8;
                auVar419._24_4_ = 0xbdebd1b8;
                auVar419._28_4_ = 0xbdebd1b8;
                auVar325 = vfmadd213ps_fma(auVar343,auVar253,auVar419);
                auVar420._8_4_ = 0x3def251a;
                auVar420._0_8_ = 0x3def251a3def251a;
                auVar420._12_4_ = 0x3def251a;
                auVar420._16_4_ = 0x3def251a;
                auVar420._20_4_ = 0x3def251a;
                auVar420._24_4_ = 0x3def251a;
                auVar420._28_4_ = 0x3def251a;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar420);
                auVar421._8_4_ = 0xbdfe5d4f;
                auVar421._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar421._12_4_ = 0xbdfe5d4f;
                auVar421._16_4_ = 0xbdfe5d4f;
                auVar421._20_4_ = 0xbdfe5d4f;
                auVar421._24_4_ = 0xbdfe5d4f;
                auVar421._28_4_ = 0xbdfe5d4f;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar421);
                auVar422._8_4_ = 0x3e11e9bf;
                auVar422._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar422._12_4_ = 0x3e11e9bf;
                auVar422._16_4_ = 0x3e11e9bf;
                auVar422._20_4_ = 0x3e11e9bf;
                auVar422._24_4_ = 0x3e11e9bf;
                auVar422._28_4_ = 0x3e11e9bf;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar422);
                auVar423._8_4_ = 0xbe2aae50;
                auVar423._0_8_ = 0xbe2aae50be2aae50;
                auVar423._12_4_ = 0xbe2aae50;
                auVar423._16_4_ = 0xbe2aae50;
                auVar423._20_4_ = 0xbe2aae50;
                auVar423._24_4_ = 0xbe2aae50;
                auVar423._28_4_ = 0xbe2aae50;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar423);
                auVar424._8_4_ = 0x3e4cceac;
                auVar424._0_8_ = 0x3e4cceac3e4cceac;
                auVar424._12_4_ = 0x3e4cceac;
                auVar424._16_4_ = 0x3e4cceac;
                auVar424._20_4_ = 0x3e4cceac;
                auVar424._24_4_ = 0x3e4cceac;
                auVar424._28_4_ = 0x3e4cceac;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar424);
                auVar425._8_4_ = 0xbe7ffffc;
                auVar425._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar425._12_4_ = 0xbe7ffffc;
                auVar425._16_4_ = 0xbe7ffffc;
                auVar425._20_4_ = 0xbe7ffffc;
                auVar425._24_4_ = 0xbe7ffffc;
                auVar425._28_4_ = 0xbe7ffffc;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar425);
                auVar426._8_4_ = 0x3eaaaaaa;
                auVar426._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar426._12_4_ = 0x3eaaaaaa;
                auVar426._16_4_ = 0x3eaaaaaa;
                auVar426._20_4_ = 0x3eaaaaaa;
                auVar426._24_4_ = 0x3eaaaaaa;
                auVar426._28_4_ = 0x3eaaaaaa;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar253,auVar426);
                auVar320 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar253,auVar282);
                auVar380._8_4_ = 0x3f317218;
                auVar380._0_8_ = 0x3f3172183f317218;
                auVar380._12_4_ = 0x3f317218;
                auVar380._16_4_ = 0x3f317218;
                auVar380._20_4_ = 0x3f317218;
                auVar380._24_4_ = 0x3f317218;
                auVar380._28_4_ = 0x3f317218;
                auVar325 = vfmadd213ps_fma(auVar310,auVar380,auVar253);
                auVar24._4_4_ = auVar253._4_4_ * auVar253._4_4_;
                auVar24._0_4_ = auVar253._0_4_ * auVar253._0_4_;
                auVar24._8_4_ = auVar253._8_4_ * auVar253._8_4_;
                auVar24._12_4_ = auVar253._12_4_ * auVar253._12_4_;
                auVar24._16_4_ = auVar253._16_4_ * auVar253._16_4_;
                auVar24._20_4_ = auVar253._20_4_ * auVar253._20_4_;
                auVar24._24_4_ = auVar253._24_4_ * auVar253._24_4_;
                auVar24._28_4_ = auVar253._28_4_;
                auVar325 = vfmadd231ps_fma(ZEXT1632(auVar325),auVar24,ZEXT1632(auVar320));
                auVar427._8_4_ = 0xc0000000;
                auVar427._0_8_ = 0xc0000000c0000000;
                auVar427._12_4_ = 0xc0000000;
                auVar427._16_4_ = 0xc0000000;
                auVar427._20_4_ = 0xc0000000;
                auVar427._24_4_ = 0xc0000000;
                auVar427._28_4_ = 0xc0000000;
                auVar25._4_4_ = auVar325._4_4_ * -2.0;
                auVar25._0_4_ = auVar325._0_4_ * -2.0;
                auVar25._8_4_ = auVar325._8_4_ * -2.0;
                auVar25._12_4_ = auVar325._12_4_ * -2.0;
                auVar25._16_4_ = 0x80000000;
                auVar25._20_4_ = 0x80000000;
                auVar25._24_4_ = 0x80000000;
                auVar25._28_4_ = auVar253._28_4_;
                auVar315._8_4_ = 0x7fffffff;
                auVar315._0_8_ = 0x7fffffff7fffffff;
                auVar315._12_4_ = 0x7fffffff;
                auVar315._16_4_ = 0x7fffffff;
                auVar315._20_4_ = 0x7fffffff;
                auVar315._24_4_ = 0x7fffffff;
                auVar315._28_4_ = 0x7fffffff;
                auVar310 = vblendvps_avx(auVar25,auVar315,auVar304);
                auVar310 = vminps_avx(auVar217,auVar310);
                auVar336 = vmaxps_avx(auVar374,auVar310);
                auVar381 = ZEXT3264(auVar305);
                auVar325 = vfmadd213ps_fma(auVar305,auVar336,auVar282);
                auVar305 = vroundps_avx(ZEXT1632(auVar325),1);
                auVar310 = vcmpps_avx(ZEXT1632(auVar325),auVar305,1);
                auVar310 = vandps_avx(auVar310,auVar289);
                auVar310 = vsubps_avx(auVar305,auVar310);
                auVar320 = vfnmadd231ps_fma(auVar336,auVar310,auVar380);
                auVar336 = ZEXT1632(auVar320);
                fVar63 = auVar320._0_4_;
                fVar360 = auVar320._4_4_;
                fVar361 = auVar320._8_4_;
                fVar362 = auVar320._12_4_;
                auVar26._28_4_ = auVar305._28_4_;
                auVar26._0_28_ =
                     ZEXT1628(CONCAT412(fVar362 * fVar362,
                                        CONCAT48(fVar361 * fVar361,
                                                 CONCAT44(fVar360 * fVar360,fVar63 * fVar63))));
                auVar344._8_4_ = 0x39506967;
                auVar344._0_8_ = 0x3950696739506967;
                auVar344._12_4_ = 0x39506967;
                auVar344._16_4_ = 0x39506967;
                auVar344._20_4_ = 0x39506967;
                auVar344._24_4_ = 0x39506967;
                auVar344._28_4_ = 0x39506967;
                auVar136._8_4_ = 0x3ab743ce;
                auVar136._0_8_ = 0x3ab743ce3ab743ce;
                auVar136._12_4_ = 0x3ab743ce;
                auVar136._16_4_ = 0x3ab743ce;
                auVar136._20_4_ = 0x3ab743ce;
                auVar136._24_4_ = 0x3ab743ce;
                auVar136._28_4_ = 0x3ab743ce;
                auVar325 = vfmadd213ps_fma(auVar344,auVar336,auVar136);
                auVar137._8_4_ = 0x3c088908;
                auVar137._0_8_ = 0x3c0889083c088908;
                auVar137._12_4_ = 0x3c088908;
                auVar137._16_4_ = 0x3c088908;
                auVar137._20_4_ = 0x3c088908;
                auVar137._24_4_ = 0x3c088908;
                auVar137._28_4_ = 0x3c088908;
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar137);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),auVar336,auVar395);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar388);
                auVar325 = vfmadd213ps_fma(ZEXT1632(auVar325),ZEXT1632(auVar320),auVar282);
                auVar254._0_4_ = fVar63 + 1.0;
                auVar254._4_4_ = fVar360 + 1.0;
                auVar254._8_4_ = fVar361 + 1.0;
                auVar254._12_4_ = fVar362 + 1.0;
                auVar254._16_4_ = 0x3f800000;
                auVar254._20_4_ = 0x3f800000;
                auVar254._24_4_ = 0x3f800000;
                auVar254._28_4_ = 0x3f800000;
                auVar325 = vfmadd231ps_fma(auVar254,auVar26,ZEXT1632(auVar325));
                auVar278._0_4_ = (int)auVar310._0_4_;
                auVar278._4_4_ = (int)auVar310._4_4_;
                auVar278._8_4_ = (int)auVar310._8_4_;
                auVar278._12_4_ = (int)auVar310._12_4_;
                auVar278._16_4_ = (int)auVar310._16_4_;
                auVar278._20_4_ = (int)auVar310._20_4_;
                auVar278._24_4_ = (int)auVar310._24_4_;
                auVar278._28_4_ = (int)auVar310._28_4_;
                auVar310 = vpslld_avx2(auVar278,0x17);
                auVar310 = vpaddd_avx2(auVar310,auVar174);
                auVar325 = vfmadd213ps_fma(auVar310,ZEXT1632(auVar325),auVar289);
                auVar310 = vrcpps_avx(ZEXT1632(auVar325));
                auVar325 = vfmsub213ps_fma(ZEXT1632(auVar325),auVar310,auVar289);
                auVar325 = vfnmadd132ps_fma(ZEXT1632(auVar325),auVar310,auVar310);
                auVar325 = vfnmadd213ps_fma(ZEXT1632(auVar325),auVar427,auVar219);
                auVar159 = ZEXT1628(auVar325);
                goto LAB_00304ddd;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar178._4_4_ = uVar1;
                auVar178._0_4_ = uVar1;
                auVar178._8_4_ = uVar1;
                auVar178._12_4_ = uVar1;
                auVar178._16_4_ = uVar1;
                auVar178._20_4_ = uVar1;
                auVar178._24_4_ = uVar1;
                auVar178._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar257._4_4_ = uVar1;
                auVar257._0_4_ = uVar1;
                auVar257._8_4_ = uVar1;
                auVar257._12_4_ = uVar1;
                auVar257._16_4_ = uVar1;
                auVar257._20_4_ = uVar1;
                auVar257._24_4_ = uVar1;
                auVar257._28_4_ = uVar1;
                auVar325 = vfmadd231ps_fma(auVar257,auVar310,auVar178);
                auVar310 = vmaxps_avx(ZEXT1632(auVar325),_DAT_00314f00);
                auVar310 = vminps_avx(auVar310,auVar289);
                auVar159 = auVar310._0_28_;
LAB_00304ddd:
                auVar389._0_4_ = auVar179._0_4_ * auVar159._0_4_;
                auVar389._4_4_ = auVar179._4_4_ * auVar159._4_4_;
                auVar389._8_4_ = auVar179._8_4_ * auVar159._8_4_;
                auVar389._12_4_ = auVar179._12_4_ * auVar159._12_4_;
                auVar389._16_4_ = auVar179._16_4_ * auVar159._16_4_;
                auVar389._20_4_ = auVar179._20_4_ * auVar159._20_4_;
                auVar389._24_4_ = auVar179._24_4_ * auVar159._24_4_;
                auVar310 = auVar389._0_32_;
              }
              *pauVar43 = auVar310;
              pauVar43 = pauVar43 + 1;
              iVar52 = iVar52 + 4;
              bVar60 = iVar37 != iVar3;
              iVar37 = iVar37 + 1;
            } while (bVar60);
          }
          local_160 = local_160 + 1;
        } while (local_160 != uVar32);
      }
      bVar60 = 0 < (int)uVar32;
      bVar58 = iVar35 == 1;
      if (iVar2 == 8 && (bVar58 && bVar60)) {
        local_58 = top_blob->data;
        local_60 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_68 = (this->weight_data_packed).data;
        local_70 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_50 = (ulong)uVar32;
        local_150 = 0;
        do {
          pvVar31 = local_58;
          pvVar29 = local_b8.data;
          if (-1 < iVar3) {
            lVar55 = local_60 * local_150;
            pauVar43 = (undefined1 (*) [32])(local_70 * local_150 + (long)local_68);
            lVar53 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar37 = 0;
            uVar49 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                fVar63 = 0.0;
              }
              else {
                fVar63 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + local_150 * 4);
              }
              if (iVar30 < 1) {
                auVar310 = SUB6432(ZEXT864(0),0);
              }
              else {
                p_Var7 = pp_Var6[-3];
                pauVar56 = (undefined1 (*) [32])
                           ((long)(_func_int ***)pvVar29 +
                           (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar37) * 4);
                auVar381 = ZEXT864(0);
                uVar47 = 0;
                pauVar44 = pauVar43;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pauVar50 = pauVar56;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      auVar325 = vfmadd231ps_fma(auVar381._0_32_,*pauVar44,*pauVar50);
                      auVar381 = ZEXT1664(auVar325);
                      pauVar44 = pauVar44 + 1;
                      pauVar50 = (undefined1 (*) [32])
                                 (*pauVar50 +
                                 (long)(*(int *)(&this->field_0xd8 + (long)p_Var7) << 3) * 4);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar310 = auVar381._0_32_;
                  uVar47 = uVar47 + 1;
                  pauVar56 = (undefined1 (*) [32])(*pauVar56 + lVar53);
                } while (uVar47 != uVar54);
              }
              auVar320._0_4_ = auVar310._16_4_ + auVar310._0_4_;
              auVar320._4_4_ = auVar310._20_4_ + auVar310._4_4_;
              auVar320._8_4_ = auVar310._24_4_ + auVar310._8_4_;
              auVar320._12_4_ = auVar310._28_4_ + auVar310._12_4_;
              auVar325 = vshufpd_avx(auVar320,auVar320,1);
              auVar223._0_4_ = auVar325._0_4_ + auVar320._0_4_;
              auVar223._4_4_ = auVar325._4_4_ + auVar320._4_4_;
              auVar223._8_4_ = auVar325._8_4_ + auVar320._8_4_;
              auVar223._12_4_ = auVar325._12_4_ + auVar320._12_4_;
              auVar325 = vmovshdup_avx(auVar223);
              fVar63 = auVar325._0_4_ + fVar63 + auVar223._0_4_;
              auVar325 = ZEXT416((uint)fVar63);
              fVar360 = fVar63;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar325 = vmaxss_avx(auVar325,ZEXT416(0));
                fVar360 = auVar325._0_4_;
                break;
              case 2:
                auVar64._0_12_ = ZEXT812(0);
                auVar64._12_4_ = 0;
                auVar325 = vcmpss_avx(auVar64,auVar325,1);
                auVar180._8_4_ = 0x3f800000;
                auVar180._0_8_ = 0x3f8000003f800000;
                auVar180._12_4_ = 0x3f800000;
                auVar325 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar180,auVar325);
                fVar360 = auVar325._0_4_ * fVar63;
                break;
              case 3:
                auVar325 = vmaxss_avx(auVar325,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar325 = vminss_avx(auVar325,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar360 = auVar325._0_4_;
                break;
              case 4:
                fVar63 = expf(-fVar63);
                fVar360 = 1.0 / (fVar63 + 1.0);
                break;
              case 5:
                local_48 = auVar325;
                fVar63 = expf(fVar63);
                fVar63 = logf(fVar63 + 1.0);
                fVar63 = tanhf(fVar63);
                fVar360 = fVar63 * (float)local_48._0_4_;
                break;
              case 6:
                fVar361 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar362 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar221 = -fVar362 / fVar361;
                fVar360 = 0.0;
                if ((fVar221 <= fVar63) && (fVar360 = fVar63, fVar63 <= fVar221 + 1.0 / fVar361)) {
                  auVar325 = vfmadd213ss_fma(ZEXT416((uint)fVar361),auVar325,ZEXT416((uint)fVar362))
                  ;
                  fVar360 = auVar325._0_4_ * fVar63;
                }
              }
              *(float *)((long)pvVar31 + uVar49 * 4 + lVar55) = fVar360;
              uVar49 = uVar49 + 1;
              iVar37 = iVar37 + 8;
            } while (uVar49 != _w);
          }
          local_150 = local_150 + 1;
        } while (local_150 != local_50);
      }
      bVar59 = 0 < (int)uVar32;
      bVar61 = iVar35 == 4;
      if (iVar2 == 8 && (bVar61 && bVar59)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_160 = 0;
        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar325._8_4_ = 0x3f000000;
        auVar325._0_8_ = 0x3f0000003f000000;
        auVar325._12_4_ = 0x3f000000;
        auVar283._8_4_ = 0x3f800000;
        auVar283._0_8_ = 0x3f8000003f800000;
        auVar283._12_4_ = 0x3f800000;
        auVar382._8_4_ = 0x3ab743ce;
        auVar382._0_8_ = 0x3ab743ce3ab743ce;
        auVar382._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar3) {
            pauVar45 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar294 = ZEXT816(0) << 0x40;
              }
              else {
                auVar294 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var4) + local_160 * 0x10);
              }
              if (0 < iVar30) {
                pauVar57 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_160 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                puVar39 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar52) * 4 + 4);
                uVar49 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    puVar38 = puVar39;
                    iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      uVar1 = puVar38[-7];
                      auVar290._4_4_ = uVar1;
                      auVar290._0_4_ = uVar1;
                      auVar290._8_4_ = uVar1;
                      auVar290._12_4_ = uVar1;
                      uVar1 = puVar38[-6];
                      auVar181._4_4_ = uVar1;
                      auVar181._0_4_ = uVar1;
                      auVar181._8_4_ = uVar1;
                      auVar181._12_4_ = uVar1;
                      uVar1 = puVar38[-5];
                      auVar222._4_4_ = uVar1;
                      auVar222._0_4_ = uVar1;
                      auVar222._8_4_ = uVar1;
                      auVar222._12_4_ = uVar1;
                      uVar1 = puVar38[-4];
                      auVar258._4_4_ = uVar1;
                      auVar258._0_4_ = uVar1;
                      auVar258._8_4_ = uVar1;
                      auVar258._12_4_ = uVar1;
                      uVar1 = puVar38[-3];
                      auVar318._4_4_ = uVar1;
                      auVar318._0_4_ = uVar1;
                      auVar318._8_4_ = uVar1;
                      auVar318._12_4_ = uVar1;
                      uVar1 = puVar38[-2];
                      auVar429._4_4_ = uVar1;
                      auVar429._0_4_ = uVar1;
                      auVar429._8_4_ = uVar1;
                      auVar429._12_4_ = uVar1;
                      uVar1 = puVar38[-1];
                      auVar347._4_4_ = uVar1;
                      auVar347._0_4_ = uVar1;
                      auVar347._8_4_ = uVar1;
                      auVar347._12_4_ = uVar1;
                      uVar1 = *puVar38;
                      auVar366._4_4_ = uVar1;
                      auVar366._0_4_ = uVar1;
                      auVar366._8_4_ = uVar1;
                      auVar366._12_4_ = uVar1;
                      auVar320 = vfmadd132ps_fma(auVar290,auVar294,*pauVar57);
                      auVar320 = vfmadd231ps_fma(auVar320,auVar181,pauVar57[1]);
                      auVar320 = vfmadd231ps_fma(auVar320,auVar222,pauVar57[2]);
                      auVar320 = vfmadd231ps_fma(auVar320,auVar258,pauVar57[3]);
                      auVar320 = vfmadd231ps_fma(auVar320,auVar318,pauVar57[4]);
                      auVar320 = vfmadd231ps_fma(auVar320,auVar429,pauVar57[5]);
                      auVar320 = vfmadd231ps_fma(auVar320,auVar347,pauVar57[6]);
                      auVar294 = vfmadd231ps_fma(auVar320,auVar366,pauVar57[7]);
                      pauVar57 = pauVar57 + 8;
                      puVar38 = puVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 3);
                      iVar35 = iVar35 + -1;
                    } while (iVar35 != 0);
                  }
                  uVar49 = uVar49 + 1;
                  puVar39 = (undefined4 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar49 != uVar54);
              }
              auVar320 = auVar381._0_16_;
              fVar361 = auVar294._4_4_;
              fVar63 = auVar294._8_4_;
              fVar360 = auVar294._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar294 = vmaxps_avx(auVar320,auVar294);
                break;
              case 2:
                auVar223 = vmaxps_avx(auVar320,auVar294);
                auVar320 = vminps_avx(auVar320,auVar294);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar293._4_4_ = uVar1;
                auVar293._0_4_ = uVar1;
                auVar293._8_4_ = uVar1;
                auVar293._12_4_ = uVar1;
                auVar294 = vfmadd213ps_fma(auVar293,auVar320,auVar223);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar399._4_4_ = uVar1;
                auVar399._0_4_ = uVar1;
                auVar399._8_4_ = uVar1;
                auVar399._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar433._4_4_ = uVar1;
                auVar433._0_4_ = uVar1;
                auVar433._8_4_ = uVar1;
                auVar433._12_4_ = uVar1;
                auVar320 = vmaxps_avx(auVar399,auVar294);
                auVar294 = vminps_avx(auVar433,auVar320);
                break;
              case 4:
                auVar291._0_8_ = auVar294._0_8_ ^ 0x8000000080000000;
                auVar291._8_4_ = -fVar63;
                auVar291._12_4_ = -fVar360;
                auVar188._8_4_ = 0x42b0c0a5;
                auVar188._0_8_ = 0x42b0c0a542b0c0a5;
                auVar188._12_4_ = 0x42b0c0a5;
                auVar320 = vminps_avx(auVar291,auVar188);
                auVar189._8_4_ = 0xc2b0c0a5;
                auVar189._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar189._12_4_ = 0xc2b0c0a5;
                auVar64 = vmaxps_avx(auVar320,auVar189);
                auVar400._8_4_ = 0x3fb8aa3b;
                auVar400._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar400._12_4_ = 0x3fb8aa3b;
                auVar320 = vfmadd213ps_fma(auVar400,auVar64,auVar325);
                auVar434._0_4_ = (int)auVar320._0_4_;
                auVar434._4_4_ = (int)auVar320._4_4_;
                auVar434._8_4_ = (int)auVar320._8_4_;
                auVar434._12_4_ = (int)auVar320._12_4_;
                auVar223 = vcvtdq2ps_avx(auVar434);
                auVar320 = vcmpps_avx(auVar320,auVar223,1);
                auVar320 = vandps_avx(auVar320,auVar283);
                auVar320 = vsubps_avx(auVar223,auVar320);
                auVar190._8_4_ = 0xbf317218;
                auVar190._0_8_ = 0xbf317218bf317218;
                auVar190._12_4_ = 0xbf317218;
                auVar64 = vfmadd231ps_fma(auVar64,auVar320,auVar190);
                fVar63 = auVar64._0_4_;
                auVar435._0_4_ = fVar63 * fVar63;
                fVar360 = auVar64._4_4_;
                auVar435._4_4_ = fVar360 * fVar360;
                fVar361 = auVar64._8_4_;
                auVar435._8_4_ = fVar361 * fVar361;
                fVar362 = auVar64._12_4_;
                auVar435._12_4_ = fVar362 * fVar362;
                auVar322._8_4_ = 0x39506967;
                auVar322._0_8_ = 0x3950696739506967;
                auVar322._12_4_ = 0x39506967;
                auVar191._8_4_ = 0x3ab743ce;
                auVar191._0_8_ = 0x3ab743ce3ab743ce;
                auVar191._12_4_ = 0x3ab743ce;
                auVar223 = vfmadd213ps_fma(auVar322,auVar64,auVar191);
                auVar80._8_4_ = 0x3c088908;
                auVar80._0_8_ = 0x3c0889083c088908;
                auVar80._12_4_ = 0x3c088908;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar80);
                auVar81._8_4_ = 0x3d2aa9c1;
                auVar81._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar81._12_4_ = 0x3d2aa9c1;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar81);
                auVar82._8_4_ = 0x3e2aaaaa;
                auVar82._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar82._12_4_ = 0x3e2aaaaa;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar82);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar325);
                auVar192._0_4_ = fVar63 + 1.0;
                auVar192._4_4_ = fVar360 + 1.0;
                auVar192._8_4_ = fVar361 + 1.0;
                auVar192._12_4_ = fVar362 + 1.0;
                auVar223 = vfmadd231ps_fma(auVar192,auVar435,auVar223);
                auVar292._0_4_ = (int)auVar320._0_4_;
                auVar292._4_4_ = (int)auVar320._4_4_;
                auVar292._8_4_ = (int)auVar320._8_4_;
                auVar292._12_4_ = (int)auVar320._12_4_;
                auVar320 = vpslld_avx(auVar292,0x17);
                auVar323._8_4_ = 0x3f800000;
                auVar323._0_8_ = 0x3f8000003f800000;
                auVar323._12_4_ = 0x3f800000;
                auVar320 = vpaddd_avx(auVar323,auVar320);
                auVar223 = vfmadd213ps_fma(auVar320,auVar223,auVar283);
                auVar320 = vrcpps_avx(auVar223);
                auVar223 = vfmsub213ps_fma(auVar223,auVar320,auVar283);
                auVar294 = vfnmadd132ps_fma(auVar223,auVar320,auVar320);
                break;
              case 5:
                auVar348._8_4_ = 0x42b0c0a5;
                auVar348._0_8_ = 0x42b0c0a542b0c0a5;
                auVar348._12_4_ = 0x42b0c0a5;
                auVar320 = vminps_avx(auVar348,auVar294);
                auVar367._8_4_ = 0xc2b0c0a5;
                auVar367._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar367._12_4_ = 0xc2b0c0a5;
                auVar64 = vmaxps_avx(auVar367,auVar320);
                auVar375._8_4_ = 0x3fb8aa3b;
                auVar375._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar375._12_4_ = 0x3fb8aa3b;
                auVar320 = vfmadd213ps_fma(auVar375,auVar64,auVar325);
                auVar396._0_4_ = (int)auVar320._0_4_;
                auVar396._4_4_ = (int)auVar320._4_4_;
                auVar396._8_4_ = (int)auVar320._8_4_;
                auVar396._12_4_ = (int)auVar320._12_4_;
                auVar223 = vcvtdq2ps_avx(auVar396);
                auVar320 = vcmpps_avx(auVar320,auVar223,1);
                auVar320 = vandps_avx(auVar320,auVar283);
                auVar320 = vsubps_avx(auVar223,auVar320);
                auVar349._8_4_ = 0x3f317218;
                auVar349._0_8_ = 0x3f3172183f317218;
                auVar349._12_4_ = 0x3f317218;
                auVar64 = vfnmadd231ps_fma(auVar64,auVar320,auVar349);
                fVar63 = auVar64._0_4_;
                auVar397._0_4_ = fVar63 * fVar63;
                fVar360 = auVar64._4_4_;
                auVar397._4_4_ = fVar360 * fVar360;
                fVar361 = auVar64._8_4_;
                auVar397._8_4_ = fVar361 * fVar361;
                fVar362 = auVar64._12_4_;
                auVar397._12_4_ = fVar362 * fVar362;
                auVar390._8_4_ = 0x39506967;
                auVar390._0_8_ = 0x3950696739506967;
                auVar390._12_4_ = 0x39506967;
                auVar223 = vfmadd213ps_fma(auVar390,auVar64,auVar382);
                auVar65._8_4_ = 0x3c088908;
                auVar65._0_8_ = 0x3c0889083c088908;
                auVar65._12_4_ = 0x3c088908;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar65);
                auVar142._8_4_ = 0x3d2aa9c1;
                auVar142._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar142._12_4_ = 0x3d2aa9c1;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar142);
                auVar143._8_4_ = 0x3e2aaaaa;
                auVar143._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar143._12_4_ = 0x3e2aaaaa;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar143);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar325);
                auVar182._0_4_ = fVar63 + 1.0;
                auVar182._4_4_ = fVar360 + 1.0;
                auVar182._8_4_ = fVar361 + 1.0;
                auVar182._12_4_ = fVar362 + 1.0;
                auVar223 = vfmadd231ps_fma(auVar182,auVar397,auVar223);
                auVar319._0_4_ = (int)auVar320._0_4_;
                auVar319._4_4_ = (int)auVar320._4_4_;
                auVar319._8_4_ = (int)auVar320._8_4_;
                auVar319._12_4_ = (int)auVar320._12_4_;
                auVar320 = vpslld_avx(auVar319,0x17);
                auVar398._8_4_ = 0x3f800000;
                auVar398._0_8_ = 0x3f8000003f800000;
                auVar398._12_4_ = 0x3f800000;
                auVar320 = vpaddd_avx(auVar320,auVar398);
                auVar181 = vfmadd213ps_fma(auVar320,auVar223,auVar283);
                auVar183._8_4_ = 0x800000;
                auVar183._0_8_ = 0x80000000800000;
                auVar183._12_4_ = 0x800000;
                auVar320 = vmaxps_avx(auVar181,auVar183);
                auVar430._8_4_ = 0x807fffff;
                auVar430._0_8_ = 0x807fffff807fffff;
                auVar430._12_4_ = 0x807fffff;
                auVar223 = vpsrld_avx(auVar320,0x17);
                auVar320 = vandps_avx(auVar430,auVar320);
                auVar431._8_4_ = 0x3f000000;
                auVar431._0_8_ = 0x3f0000003f000000;
                auVar431._12_4_ = 0x3f000000;
                auVar64 = vorps_avx(auVar431,auVar320);
                auVar432._8_4_ = 0xffffff82;
                auVar432._0_8_ = 0xffffff82ffffff82;
                auVar432._12_4_ = 0xffffff82;
                auVar180 = vpaddd_avx(auVar432,auVar223);
                auVar259._8_4_ = 0x3f3504f3;
                auVar259._0_8_ = 0x3f3504f33f3504f3;
                auVar259._12_4_ = 0x3f3504f3;
                auVar223 = vcmpps_avx(auVar64,auVar259,1);
                auVar320 = vandps_avx(auVar223,auVar64);
                auVar184._0_4_ = auVar64._0_4_ + -1.0 + auVar320._0_4_;
                auVar184._4_4_ = auVar64._4_4_ + -1.0 + auVar320._4_4_;
                auVar184._8_4_ = auVar64._8_4_ + -1.0 + auVar320._8_4_;
                auVar184._12_4_ = auVar64._12_4_ + -1.0 + auVar320._12_4_;
                auVar64 = vcmpps_avx(auVar181,ZEXT816(0),2);
                auVar180 = vcvtdq2ps_avx(auVar180);
                auVar320 = vandps_avx(auVar223,auVar283);
                auVar320 = vsubps_avx(auVar180,auVar320);
                auVar321._8_4_ = 0x3d9021bb;
                auVar321._0_8_ = 0x3d9021bb3d9021bb;
                auVar321._12_4_ = 0x3d9021bb;
                auVar66._8_4_ = 0xbdebd1b8;
                auVar66._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar66._12_4_ = 0xbdebd1b8;
                auVar223 = vfmadd213ps_fma(auVar321,auVar184,auVar66);
                auVar67._8_4_ = 0x3def251a;
                auVar67._0_8_ = 0x3def251a3def251a;
                auVar67._12_4_ = 0x3def251a;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar67);
                auVar68._8_4_ = 0xbdfe5d4f;
                auVar68._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar68._12_4_ = 0xbdfe5d4f;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar68);
                auVar69._8_4_ = 0x3e11e9bf;
                auVar69._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar69._12_4_ = 0x3e11e9bf;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar69);
                auVar70._8_4_ = 0xbe2aae50;
                auVar70._0_8_ = 0xbe2aae50be2aae50;
                auVar70._12_4_ = 0xbe2aae50;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar70);
                auVar71._8_4_ = 0x3e4cceac;
                auVar71._0_8_ = 0x3e4cceac3e4cceac;
                auVar71._12_4_ = 0x3e4cceac;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar71);
                auVar72._8_4_ = 0xbe7ffffc;
                auVar72._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar72._12_4_ = 0xbe7ffffc;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar72);
                auVar73._8_4_ = 0x3eaaaaaa;
                auVar73._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar73._12_4_ = 0x3eaaaaaa;
                auVar223 = vfmadd213ps_fma(auVar223,auVar184,auVar73);
                auVar223 = vfmsub213ps_fma(auVar223,auVar184,auVar325);
                auVar320 = vfmadd213ps_fma(auVar320,auVar349,auVar184);
                auVar185._0_4_ = auVar184._0_4_ * auVar184._0_4_;
                auVar185._4_4_ = auVar184._4_4_ * auVar184._4_4_;
                auVar185._8_4_ = auVar184._8_4_ * auVar184._8_4_;
                auVar185._12_4_ = auVar184._12_4_ * auVar184._12_4_;
                auVar320 = vfmadd231ps_fma(auVar320,auVar185,auVar223);
                auVar186._0_4_ = auVar320._0_4_ * -2.0;
                auVar186._4_4_ = auVar320._4_4_ * -2.0;
                auVar186._8_4_ = auVar320._8_4_ * -2.0;
                auVar186._12_4_ = auVar320._12_4_ * -2.0;
                auVar74._8_4_ = 0x7fffffff;
                auVar74._0_8_ = 0x7fffffff7fffffff;
                auVar74._12_4_ = 0x7fffffff;
                auVar320 = vblendvps_avx(auVar186,auVar74,auVar64);
                auVar75._8_4_ = 0x42b0c0a5;
                auVar75._0_8_ = 0x42b0c0a542b0c0a5;
                auVar75._12_4_ = 0x42b0c0a5;
                auVar320 = vminps_avx(auVar320,auVar75);
                auVar76._8_4_ = 0xc2b0c0a5;
                auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar76._12_4_ = 0xc2b0c0a5;
                auVar64 = vmaxps_avx(auVar320,auVar76);
                auVar320 = vfmadd213ps_fma(auVar375,auVar64,auVar325);
                auVar260._0_4_ = (int)auVar320._0_4_;
                auVar260._4_4_ = (int)auVar320._4_4_;
                auVar260._8_4_ = (int)auVar320._8_4_;
                auVar260._12_4_ = (int)auVar320._12_4_;
                auVar223 = vcvtdq2ps_avx(auVar260);
                auVar320 = vcmpps_avx(auVar320,auVar223,1);
                auVar320 = vandps_avx(auVar320,auVar283);
                auVar320 = vsubps_avx(auVar223,auVar320);
                auVar64 = vfnmadd231ps_fma(auVar64,auVar320,auVar349);
                fVar63 = auVar64._0_4_;
                auVar261._0_4_ = fVar63 * fVar63;
                fVar360 = auVar64._4_4_;
                auVar261._4_4_ = fVar360 * fVar360;
                fVar361 = auVar64._8_4_;
                auVar261._8_4_ = fVar361 * fVar361;
                fVar362 = auVar64._12_4_;
                auVar261._12_4_ = fVar362 * fVar362;
                auVar223 = vfmadd213ps_fma(auVar390,auVar64,auVar382);
                auVar77._8_4_ = 0x3c088908;
                auVar77._0_8_ = 0x3c0889083c088908;
                auVar77._12_4_ = 0x3c088908;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar77);
                auVar78._8_4_ = 0x3d2aa9c1;
                auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar78._12_4_ = 0x3d2aa9c1;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar78);
                auVar381 = ZEXT864(0) << 0x20;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar143);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar325);
                auVar187._0_4_ = fVar63 + 1.0;
                auVar187._4_4_ = fVar360 + 1.0;
                auVar187._8_4_ = fVar361 + 1.0;
                auVar187._12_4_ = fVar362 + 1.0;
                auVar223 = vfmadd231ps_fma(auVar187,auVar261,auVar223);
                auVar224._0_4_ = (int)auVar320._0_4_;
                auVar224._4_4_ = (int)auVar320._4_4_;
                auVar224._8_4_ = (int)auVar320._8_4_;
                auVar224._12_4_ = (int)auVar320._12_4_;
                auVar320 = vpslld_avx(auVar224,0x17);
                auVar320 = vpaddd_avx(auVar398,auVar320);
                auVar223 = vfmadd213ps_fma(auVar320,auVar223,auVar283);
                auVar320 = vrcpps_avx(auVar223);
                auVar262._0_4_ = auVar320._0_4_ + auVar320._0_4_;
                auVar262._4_4_ = auVar320._4_4_ + auVar320._4_4_;
                auVar262._8_4_ = auVar320._8_4_ + auVar320._8_4_;
                auVar262._12_4_ = auVar320._12_4_ + auVar320._12_4_;
                auVar79._8_4_ = 0x40000000;
                auVar79._0_8_ = 0x4000000040000000;
                auVar79._12_4_ = 0x40000000;
                auVar223 = vfmsub213ps_fma(auVar223,auVar262,auVar79);
                auVar320 = vfnmadd213ps_fma(auVar223,auVar320,auVar262);
                auVar294 = vfmsub231ps_fma(auVar294,auVar294,auVar320);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar193._4_4_ = uVar1;
                auVar193._0_4_ = uVar1;
                auVar193._8_4_ = uVar1;
                auVar193._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar225._4_4_ = uVar1;
                auVar225._0_4_ = uVar1;
                auVar225._8_4_ = uVar1;
                auVar225._12_4_ = uVar1;
                auVar223 = vfmadd231ps_fma(auVar225,auVar294,auVar193);
                auVar320 = vmaxps_avx(auVar320,auVar223);
                auVar320 = vminps_avx(auVar320,auVar283);
                auVar294._0_4_ = auVar320._0_4_ * auVar294._0_4_;
                auVar294._4_4_ = auVar320._4_4_ * fVar361;
                auVar294._8_4_ = auVar320._8_4_ * fVar63;
                auVar294._12_4_ = auVar320._12_4_ * fVar360;
              }
              *pauVar45 = auVar294;
              pauVar45 = pauVar45 + 1;
              iVar52 = iVar52 + 8;
              bVar62 = iVar37 != iVar3;
              iVar37 = iVar37 + 1;
            } while (bVar62);
          }
          local_160 = local_160 + 1;
        } while (local_160 != uVar32);
      }
      if (iVar2 == 4 && (bVar61 && bVar59)) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_160 = 0;
        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar279._8_4_ = 0x3f000000;
        auVar279._0_8_ = 0x3f0000003f000000;
        auVar279._12_4_ = 0x3f000000;
        auVar284._8_4_ = 0x3f800000;
        auVar284._0_8_ = 0x3f8000003f800000;
        auVar284._12_4_ = 0x3f800000;
        auVar383._8_4_ = 0x3ab743ce;
        auVar383._0_8_ = 0x3ab743ce3ab743ce;
        auVar383._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar3) {
            pauVar45 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar299 = ZEXT816(0) << 0x40;
              }
              else {
                auVar299 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var4) + local_160 * 0x10);
              }
              if (0 < iVar30) {
                pauVar57 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_160 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                puVar39 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar52) * 4 + 4);
                uVar49 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    puVar38 = puVar39;
                    iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      uVar1 = puVar38[-3];
                      auVar295._4_4_ = uVar1;
                      auVar295._0_4_ = uVar1;
                      auVar295._8_4_ = uVar1;
                      auVar295._12_4_ = uVar1;
                      uVar1 = puVar38[-2];
                      auVar194._4_4_ = uVar1;
                      auVar194._0_4_ = uVar1;
                      auVar194._8_4_ = uVar1;
                      auVar194._12_4_ = uVar1;
                      uVar1 = puVar38[-1];
                      auVar226._4_4_ = uVar1;
                      auVar226._0_4_ = uVar1;
                      auVar226._8_4_ = uVar1;
                      auVar226._12_4_ = uVar1;
                      uVar1 = *puVar38;
                      auVar263._4_4_ = uVar1;
                      auVar263._0_4_ = uVar1;
                      auVar263._8_4_ = uVar1;
                      auVar263._12_4_ = uVar1;
                      auVar325 = vfmadd132ps_fma(auVar295,auVar299,*pauVar57);
                      auVar325 = vfmadd231ps_fma(auVar325,auVar194,pauVar57[1]);
                      auVar325 = vfmadd231ps_fma(auVar325,auVar226,pauVar57[2]);
                      auVar299 = vfmadd231ps_fma(auVar325,auVar263,pauVar57[3]);
                      pauVar57 = pauVar57 + 4;
                      puVar38 = puVar38 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar35 = iVar35 + -1;
                    } while (iVar35 != 0);
                  }
                  uVar49 = uVar49 + 1;
                  puVar39 = (undefined4 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar49 != uVar54);
              }
              auVar325 = auVar381._0_16_;
              fVar361 = auVar299._4_4_;
              fVar63 = auVar299._8_4_;
              fVar360 = auVar299._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar299 = vmaxps_avx(auVar299,auVar325);
                break;
              case 2:
                auVar320 = vmaxps_avx(auVar299,auVar325);
                auVar325 = vminps_avx(auVar299,auVar325);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar298._4_4_ = uVar1;
                auVar298._0_4_ = uVar1;
                auVar298._8_4_ = uVar1;
                auVar298._12_4_ = uVar1;
                auVar299 = vfmadd213ps_fma(auVar298,auVar325,auVar320);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar404._4_4_ = uVar1;
                auVar404._0_4_ = uVar1;
                auVar404._8_4_ = uVar1;
                auVar404._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar439._4_4_ = uVar1;
                auVar439._0_4_ = uVar1;
                auVar439._8_4_ = uVar1;
                auVar439._12_4_ = uVar1;
                auVar325 = vmaxps_avx(auVar404,auVar299);
                auVar299 = vminps_avx(auVar439,auVar325);
                break;
              case 4:
                auVar296._0_8_ = auVar299._0_8_ ^ 0x8000000080000000;
                auVar296._8_4_ = -fVar63;
                auVar296._12_4_ = -fVar360;
                auVar201._8_4_ = 0x42b0c0a5;
                auVar201._0_8_ = 0x42b0c0a542b0c0a5;
                auVar201._12_4_ = 0x42b0c0a5;
                auVar325 = vminps_avx(auVar296,auVar201);
                auVar202._8_4_ = 0xc2b0c0a5;
                auVar202._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar202._12_4_ = 0xc2b0c0a5;
                auVar223 = vmaxps_avx(auVar325,auVar202);
                auVar405._8_4_ = 0x3fb8aa3b;
                auVar405._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar405._12_4_ = 0x3fb8aa3b;
                auVar325 = vfmadd213ps_fma(auVar405,auVar223,auVar279);
                auVar440._0_4_ = (int)auVar325._0_4_;
                auVar440._4_4_ = (int)auVar325._4_4_;
                auVar440._8_4_ = (int)auVar325._8_4_;
                auVar440._12_4_ = (int)auVar325._12_4_;
                auVar320 = vcvtdq2ps_avx(auVar440);
                auVar325 = vcmpps_avx(auVar325,auVar320,1);
                auVar325 = vandps_avx(auVar325,auVar284);
                auVar325 = vsubps_avx(auVar320,auVar325);
                auVar203._8_4_ = 0xbf317218;
                auVar203._0_8_ = 0xbf317218bf317218;
                auVar203._12_4_ = 0xbf317218;
                auVar223 = vfmadd231ps_fma(auVar223,auVar325,auVar203);
                fVar63 = auVar223._0_4_;
                auVar441._0_4_ = fVar63 * fVar63;
                fVar360 = auVar223._4_4_;
                auVar441._4_4_ = fVar360 * fVar360;
                fVar361 = auVar223._8_4_;
                auVar441._8_4_ = fVar361 * fVar361;
                fVar362 = auVar223._12_4_;
                auVar441._12_4_ = fVar362 * fVar362;
                auVar327._8_4_ = 0x39506967;
                auVar327._0_8_ = 0x3950696739506967;
                auVar327._12_4_ = 0x39506967;
                auVar204._8_4_ = 0x3ab743ce;
                auVar204._0_8_ = 0x3ab743ce3ab743ce;
                auVar204._12_4_ = 0x3ab743ce;
                auVar320 = vfmadd213ps_fma(auVar327,auVar223,auVar204);
                auVar98._8_4_ = 0x3c088908;
                auVar98._0_8_ = 0x3c0889083c088908;
                auVar98._12_4_ = 0x3c088908;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar98);
                auVar99._8_4_ = 0x3d2aa9c1;
                auVar99._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar99._12_4_ = 0x3d2aa9c1;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar99);
                auVar100._8_4_ = 0x3e2aaaaa;
                auVar100._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar100._12_4_ = 0x3e2aaaaa;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar100);
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar279);
                auVar205._0_4_ = fVar63 + 1.0;
                auVar205._4_4_ = fVar360 + 1.0;
                auVar205._8_4_ = fVar361 + 1.0;
                auVar205._12_4_ = fVar362 + 1.0;
                auVar320 = vfmadd231ps_fma(auVar205,auVar441,auVar320);
                auVar297._0_4_ = (int)auVar325._0_4_;
                auVar297._4_4_ = (int)auVar325._4_4_;
                auVar297._8_4_ = (int)auVar325._8_4_;
                auVar297._12_4_ = (int)auVar325._12_4_;
                auVar325 = vpslld_avx(auVar297,0x17);
                auVar328._8_4_ = 0x3f800000;
                auVar328._0_8_ = 0x3f8000003f800000;
                auVar328._12_4_ = 0x3f800000;
                auVar325 = vpaddd_avx(auVar328,auVar325);
                auVar320 = vfmadd213ps_fma(auVar325,auVar320,auVar284);
                auVar325 = vrcpps_avx(auVar320);
                auVar320 = vfmsub213ps_fma(auVar320,auVar325,auVar284);
                auVar299 = vfnmadd132ps_fma(auVar320,auVar325,auVar325);
                break;
              case 5:
                auVar350._8_4_ = 0x42b0c0a5;
                auVar350._0_8_ = 0x42b0c0a542b0c0a5;
                auVar350._12_4_ = 0x42b0c0a5;
                auVar325 = vminps_avx(auVar350,auVar299);
                auVar368._8_4_ = 0xc2b0c0a5;
                auVar368._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar368._12_4_ = 0xc2b0c0a5;
                auVar223 = vmaxps_avx(auVar368,auVar325);
                auVar376._8_4_ = 0x3fb8aa3b;
                auVar376._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar376._12_4_ = 0x3fb8aa3b;
                auVar325 = vfmadd213ps_fma(auVar376,auVar223,auVar279);
                auVar401._0_4_ = (int)auVar325._0_4_;
                auVar401._4_4_ = (int)auVar325._4_4_;
                auVar401._8_4_ = (int)auVar325._8_4_;
                auVar401._12_4_ = (int)auVar325._12_4_;
                auVar320 = vcvtdq2ps_avx(auVar401);
                auVar325 = vcmpps_avx(auVar325,auVar320,1);
                auVar325 = vandps_avx(auVar325,auVar284);
                auVar325 = vsubps_avx(auVar320,auVar325);
                auVar369._8_4_ = 0x3f317218;
                auVar369._0_8_ = 0x3f3172183f317218;
                auVar369._12_4_ = 0x3f317218;
                auVar223 = vfnmadd231ps_fma(auVar223,auVar325,auVar369);
                fVar63 = auVar223._0_4_;
                auVar402._0_4_ = fVar63 * fVar63;
                fVar360 = auVar223._4_4_;
                auVar402._4_4_ = fVar360 * fVar360;
                fVar361 = auVar223._8_4_;
                auVar402._8_4_ = fVar361 * fVar361;
                fVar362 = auVar223._12_4_;
                auVar402._12_4_ = fVar362 * fVar362;
                auVar391._8_4_ = 0x39506967;
                auVar391._0_8_ = 0x3950696739506967;
                auVar391._12_4_ = 0x39506967;
                auVar320 = vfmadd213ps_fma(auVar391,auVar223,auVar383);
                auVar83._8_4_ = 0x3c088908;
                auVar83._0_8_ = 0x3c0889083c088908;
                auVar83._12_4_ = 0x3c088908;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar83);
                auVar144._8_4_ = 0x3d2aa9c1;
                auVar144._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar144._12_4_ = 0x3d2aa9c1;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar144);
                auVar351._8_4_ = 0x3e2aaaaa;
                auVar351._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar351._12_4_ = 0x3e2aaaaa;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar351);
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar279);
                auVar195._0_4_ = fVar63 + 1.0;
                auVar195._4_4_ = fVar360 + 1.0;
                auVar195._8_4_ = fVar361 + 1.0;
                auVar195._12_4_ = fVar362 + 1.0;
                auVar320 = vfmadd231ps_fma(auVar195,auVar402,auVar320);
                auVar324._0_4_ = (int)auVar325._0_4_;
                auVar324._4_4_ = (int)auVar325._4_4_;
                auVar324._8_4_ = (int)auVar325._8_4_;
                auVar324._12_4_ = (int)auVar325._12_4_;
                auVar325 = vpslld_avx(auVar324,0x17);
                auVar403._8_4_ = 0x3f800000;
                auVar403._0_8_ = 0x3f8000003f800000;
                auVar403._12_4_ = 0x3f800000;
                auVar325 = vpaddd_avx(auVar325,auVar403);
                auVar180 = vfmadd213ps_fma(auVar325,auVar320,auVar284);
                auVar196._8_4_ = 0x800000;
                auVar196._0_8_ = 0x80000000800000;
                auVar196._12_4_ = 0x800000;
                auVar325 = vmaxps_avx(auVar180,auVar196);
                auVar436._8_4_ = 0x807fffff;
                auVar436._0_8_ = 0x807fffff807fffff;
                auVar436._12_4_ = 0x807fffff;
                auVar320 = vpsrld_avx(auVar325,0x17);
                auVar325 = vandps_avx(auVar436,auVar325);
                auVar437._8_4_ = 0x3f000000;
                auVar437._0_8_ = 0x3f0000003f000000;
                auVar437._12_4_ = 0x3f000000;
                auVar223 = vorps_avx(auVar437,auVar325);
                auVar438._8_4_ = 0xffffff82;
                auVar438._0_8_ = 0xffffff82ffffff82;
                auVar438._12_4_ = 0xffffff82;
                auVar64 = vpaddd_avx(auVar438,auVar320);
                auVar264._8_4_ = 0x3f3504f3;
                auVar264._0_8_ = 0x3f3504f33f3504f3;
                auVar264._12_4_ = 0x3f3504f3;
                auVar320 = vcmpps_avx(auVar223,auVar264,1);
                auVar325 = vandps_avx(auVar320,auVar223);
                auVar197._0_4_ = auVar223._0_4_ + -1.0 + auVar325._0_4_;
                auVar197._4_4_ = auVar223._4_4_ + -1.0 + auVar325._4_4_;
                auVar197._8_4_ = auVar223._8_4_ + -1.0 + auVar325._8_4_;
                auVar197._12_4_ = auVar223._12_4_ + -1.0 + auVar325._12_4_;
                auVar223 = vcmpps_avx(auVar180,ZEXT816(0),2);
                auVar64 = vcvtdq2ps_avx(auVar64);
                auVar325 = vandps_avx(auVar320,auVar284);
                auVar325 = vsubps_avx(auVar64,auVar325);
                auVar326._8_4_ = 0x3d9021bb;
                auVar326._0_8_ = 0x3d9021bb3d9021bb;
                auVar326._12_4_ = 0x3d9021bb;
                auVar84._8_4_ = 0xbdebd1b8;
                auVar84._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar84._12_4_ = 0xbdebd1b8;
                auVar320 = vfmadd213ps_fma(auVar326,auVar197,auVar84);
                auVar85._8_4_ = 0x3def251a;
                auVar85._0_8_ = 0x3def251a3def251a;
                auVar85._12_4_ = 0x3def251a;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar85);
                auVar86._8_4_ = 0xbdfe5d4f;
                auVar86._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar86._12_4_ = 0xbdfe5d4f;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar86);
                auVar87._8_4_ = 0x3e11e9bf;
                auVar87._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar87._12_4_ = 0x3e11e9bf;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar87);
                auVar88._8_4_ = 0xbe2aae50;
                auVar88._0_8_ = 0xbe2aae50be2aae50;
                auVar88._12_4_ = 0xbe2aae50;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar88);
                auVar89._8_4_ = 0x3e4cceac;
                auVar89._0_8_ = 0x3e4cceac3e4cceac;
                auVar89._12_4_ = 0x3e4cceac;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar89);
                auVar90._8_4_ = 0xbe7ffffc;
                auVar90._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar90._12_4_ = 0xbe7ffffc;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar90);
                auVar91._8_4_ = 0x3eaaaaaa;
                auVar91._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar91._12_4_ = 0x3eaaaaaa;
                auVar320 = vfmadd213ps_fma(auVar320,auVar197,auVar91);
                auVar320 = vfmsub213ps_fma(auVar320,auVar197,auVar279);
                auVar325 = vfmadd213ps_fma(auVar325,auVar369,auVar197);
                auVar198._0_4_ = auVar197._0_4_ * auVar197._0_4_;
                auVar198._4_4_ = auVar197._4_4_ * auVar197._4_4_;
                auVar198._8_4_ = auVar197._8_4_ * auVar197._8_4_;
                auVar198._12_4_ = auVar197._12_4_ * auVar197._12_4_;
                auVar325 = vfmadd231ps_fma(auVar325,auVar198,auVar320);
                auVar199._0_4_ = auVar325._0_4_ * -2.0;
                auVar199._4_4_ = auVar325._4_4_ * -2.0;
                auVar199._8_4_ = auVar325._8_4_ * -2.0;
                auVar199._12_4_ = auVar325._12_4_ * -2.0;
                auVar92._8_4_ = 0x7fffffff;
                auVar92._0_8_ = 0x7fffffff7fffffff;
                auVar92._12_4_ = 0x7fffffff;
                auVar325 = vblendvps_avx(auVar199,auVar92,auVar223);
                auVar93._8_4_ = 0x42b0c0a5;
                auVar93._0_8_ = 0x42b0c0a542b0c0a5;
                auVar93._12_4_ = 0x42b0c0a5;
                auVar325 = vminps_avx(auVar325,auVar93);
                auVar94._8_4_ = 0xc2b0c0a5;
                auVar94._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar94._12_4_ = 0xc2b0c0a5;
                auVar223 = vmaxps_avx(auVar325,auVar94);
                auVar325 = vfmadd213ps_fma(auVar376,auVar223,auVar279);
                auVar265._0_4_ = (int)auVar325._0_4_;
                auVar265._4_4_ = (int)auVar325._4_4_;
                auVar265._8_4_ = (int)auVar325._8_4_;
                auVar265._12_4_ = (int)auVar325._12_4_;
                auVar320 = vcvtdq2ps_avx(auVar265);
                auVar325 = vcmpps_avx(auVar325,auVar320,1);
                auVar325 = vandps_avx(auVar325,auVar284);
                auVar325 = vsubps_avx(auVar320,auVar325);
                auVar223 = vfnmadd231ps_fma(auVar223,auVar325,auVar369);
                fVar63 = auVar223._0_4_;
                auVar266._0_4_ = fVar63 * fVar63;
                fVar360 = auVar223._4_4_;
                auVar266._4_4_ = fVar360 * fVar360;
                fVar361 = auVar223._8_4_;
                auVar266._8_4_ = fVar361 * fVar361;
                fVar362 = auVar223._12_4_;
                auVar266._12_4_ = fVar362 * fVar362;
                auVar320 = vfmadd213ps_fma(auVar391,auVar223,auVar383);
                auVar95._8_4_ = 0x3c088908;
                auVar95._0_8_ = 0x3c0889083c088908;
                auVar95._12_4_ = 0x3c088908;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar95);
                auVar96._8_4_ = 0x3d2aa9c1;
                auVar96._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar96._12_4_ = 0x3d2aa9c1;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar96);
                auVar381 = ZEXT864(0) << 0x20;
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar351);
                auVar320 = vfmadd213ps_fma(auVar320,auVar223,auVar279);
                auVar200._0_4_ = fVar63 + 1.0;
                auVar200._4_4_ = fVar360 + 1.0;
                auVar200._8_4_ = fVar361 + 1.0;
                auVar200._12_4_ = fVar362 + 1.0;
                auVar320 = vfmadd231ps_fma(auVar200,auVar266,auVar320);
                auVar227._0_4_ = (int)auVar325._0_4_;
                auVar227._4_4_ = (int)auVar325._4_4_;
                auVar227._8_4_ = (int)auVar325._8_4_;
                auVar227._12_4_ = (int)auVar325._12_4_;
                auVar325 = vpslld_avx(auVar227,0x17);
                auVar325 = vpaddd_avx(auVar403,auVar325);
                auVar320 = vfmadd213ps_fma(auVar325,auVar320,auVar284);
                auVar325 = vrcpps_avx(auVar320);
                auVar267._0_4_ = auVar325._0_4_ + auVar325._0_4_;
                auVar267._4_4_ = auVar325._4_4_ + auVar325._4_4_;
                auVar267._8_4_ = auVar325._8_4_ + auVar325._8_4_;
                auVar267._12_4_ = auVar325._12_4_ + auVar325._12_4_;
                auVar97._8_4_ = 0x40000000;
                auVar97._0_8_ = 0x4000000040000000;
                auVar97._12_4_ = 0x40000000;
                auVar320 = vfmsub213ps_fma(auVar320,auVar267,auVar97);
                auVar325 = vfnmadd213ps_fma(auVar320,auVar325,auVar267);
                auVar299 = vfmsub231ps_fma(auVar299,auVar299,auVar325);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar206._4_4_ = uVar1;
                auVar206._0_4_ = uVar1;
                auVar206._8_4_ = uVar1;
                auVar206._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar228._4_4_ = uVar1;
                auVar228._0_4_ = uVar1;
                auVar228._8_4_ = uVar1;
                auVar228._12_4_ = uVar1;
                auVar320 = vfmadd231ps_fma(auVar228,auVar299,auVar206);
                auVar325 = vmaxps_avx(auVar320,auVar325);
                auVar325 = vminps_avx(auVar325,auVar284);
                auVar299._0_4_ = auVar325._0_4_ * auVar299._0_4_;
                auVar299._4_4_ = auVar325._4_4_ * fVar361;
                auVar299._8_4_ = auVar325._8_4_ * fVar63;
                auVar299._12_4_ = auVar325._12_4_ * fVar360;
              }
              *pauVar45 = auVar299;
              pauVar45 = pauVar45 + 1;
              iVar52 = iVar52 + 4;
              bVar62 = iVar37 != iVar3;
              iVar37 = iVar37 + 1;
            } while (bVar62);
          }
          local_160 = local_160 + 1;
        } while (local_160 != uVar32);
      }
      if ((bVar61 && bVar59) && iVar2 == 1) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        uVar49 = 0;
        auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar389 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar280._8_4_ = 0x3f800000;
        auVar280._0_8_ = 0x3f8000003f800000;
        auVar280._12_4_ = 0x3f800000;
        auVar392._8_4_ = 0x3c088908;
        auVar392._0_8_ = 0x3c0889083c088908;
        auVar392._12_4_ = 0x3c088908;
        do {
          if (-1 < iVar3) {
            pauVar45 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar49 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar37 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar406 = ZEXT816(0) << 0x40;
              }
              else {
                auVar406 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar49 * 0x10);
              }
              auVar179 = ZEXT1664(auVar406);
              if (0 < iVar30) {
                pauVar57 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * uVar49 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var7 = pp_Var6[-3];
                puVar39 = (undefined4 *)
                          ((long)(_func_int ***)local_b8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar37) * 4);
                uVar47 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    puVar38 = puVar39;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      uVar1 = *puVar38;
                      auVar101._4_4_ = uVar1;
                      auVar101._0_4_ = uVar1;
                      auVar101._8_4_ = uVar1;
                      auVar101._12_4_ = uVar1;
                      auVar325 = vfmadd231ps_fma(auVar179._0_16_,auVar101,*pauVar57);
                      auVar179 = ZEXT1664(auVar325);
                      pauVar57 = pauVar57 + 1;
                      puVar38 = puVar38 + *(int *)(&this->field_0xd8 + (long)p_Var7);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar406 = auVar179._0_16_;
                  uVar47 = uVar47 + 1;
                  puVar39 = (undefined4 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar47 != uVar54);
              }
              auVar325 = auVar381._0_16_;
              auVar320 = auVar389._0_16_;
              fVar63 = auVar406._4_4_;
              fVar360 = auVar406._8_4_;
              fVar361 = auVar406._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar406 = vmaxps_avx(auVar406,auVar325);
                break;
              case 2:
                auVar320 = vmaxps_avx(auVar406,auVar325);
                auVar325 = vminps_avx(auVar406,auVar325);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar409._4_4_ = uVar1;
                auVar409._0_4_ = uVar1;
                auVar409._8_4_ = uVar1;
                auVar409._12_4_ = uVar1;
                auVar406 = vfmadd213ps_fma(auVar409,auVar325,auVar320);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar301._4_4_ = uVar1;
                auVar301._0_4_ = uVar1;
                auVar301._8_4_ = uVar1;
                auVar301._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar444._4_4_ = uVar1;
                auVar444._0_4_ = uVar1;
                auVar444._8_4_ = uVar1;
                auVar444._12_4_ = uVar1;
                auVar325 = vmaxps_avx(auVar406,auVar301);
                auVar406 = vminps_avx(auVar444,auVar325);
                break;
              case 4:
                auVar302._0_8_ = auVar406._0_8_ ^ 0x8000000080000000;
                auVar302._8_4_ = -fVar360;
                auVar302._12_4_ = -fVar361;
                auVar104._8_4_ = 0x42b0c0a5;
                auVar104._0_8_ = 0x42b0c0a542b0c0a5;
                auVar104._12_4_ = 0x42b0c0a5;
                auVar325 = vminps_avx(auVar302,auVar104);
                auVar105._8_4_ = 0xc2b0c0a5;
                auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar105._12_4_ = 0xc2b0c0a5;
                auVar64 = vmaxps_avx(auVar325,auVar105);
                auVar407._8_4_ = 0x3fb8aa3b;
                auVar407._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar407._12_4_ = 0x3fb8aa3b;
                auVar325 = vfmadd213ps_fma(auVar407,auVar64,auVar320);
                auVar445._0_4_ = (int)auVar325._0_4_;
                auVar445._4_4_ = (int)auVar325._4_4_;
                auVar445._8_4_ = (int)auVar325._8_4_;
                auVar445._12_4_ = (int)auVar325._12_4_;
                auVar223 = vcvtdq2ps_avx(auVar445);
                auVar325 = vcmpps_avx(auVar325,auVar223,1);
                auVar325 = vandps_avx(auVar325,auVar280);
                auVar325 = vsubps_avx(auVar223,auVar325);
                auVar106._8_4_ = 0xbf317218;
                auVar106._0_8_ = 0xbf317218bf317218;
                auVar106._12_4_ = 0xbf317218;
                auVar64 = vfmadd231ps_fma(auVar64,auVar325,auVar106);
                fVar63 = auVar64._0_4_;
                auVar446._0_4_ = fVar63 * fVar63;
                fVar360 = auVar64._4_4_;
                auVar446._4_4_ = fVar360 * fVar360;
                fVar361 = auVar64._8_4_;
                auVar446._8_4_ = fVar361 * fVar361;
                fVar362 = auVar64._12_4_;
                auVar446._12_4_ = fVar362 * fVar362;
                auVar333._8_4_ = 0x39506967;
                auVar333._0_8_ = 0x3950696739506967;
                auVar333._12_4_ = 0x39506967;
                auVar107._8_4_ = 0x3ab743ce;
                auVar107._0_8_ = 0x3ab743ce3ab743ce;
                auVar107._12_4_ = 0x3ab743ce;
                auVar223 = vfmadd213ps_fma(auVar333,auVar64,auVar107);
                auVar108._8_4_ = 0x3c088908;
                auVar108._0_8_ = 0x3c0889083c088908;
                auVar108._12_4_ = 0x3c088908;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar108);
                auVar109._8_4_ = 0x3d2aa9c1;
                auVar109._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar109._12_4_ = 0x3d2aa9c1;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar109);
                auVar110._8_4_ = 0x3e2aaaaa;
                auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar110._12_4_ = 0x3e2aaaaa;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar110);
                auVar320 = vfmadd213ps_fma(auVar223,auVar64,auVar320);
                auVar303._0_4_ = fVar63 + 1.0;
                auVar303._4_4_ = fVar360 + 1.0;
                auVar303._8_4_ = fVar361 + 1.0;
                auVar303._12_4_ = fVar362 + 1.0;
                auVar320 = vfmadd231ps_fma(auVar303,auVar446,auVar320);
                auVar334._0_4_ = (int)auVar325._0_4_;
                auVar334._4_4_ = (int)auVar325._4_4_;
                auVar334._8_4_ = (int)auVar325._8_4_;
                auVar334._12_4_ = (int)auVar325._12_4_;
                auVar325 = vpslld_avx(auVar334,0x17);
                auVar408._8_4_ = 0x3f800000;
                auVar408._0_8_ = 0x3f8000003f800000;
                auVar408._12_4_ = 0x3f800000;
                auVar325 = vpaddd_avx(auVar325,auVar408);
                auVar320 = vfmadd213ps_fma(auVar325,auVar320,auVar280);
                auVar325 = vrcpps_avx(auVar320);
                auVar320 = vfmsub213ps_fma(auVar320,auVar325,auVar280);
                auVar406 = vfnmadd132ps_fma(auVar320,auVar325,auVar325);
                break;
              case 5:
                auVar352._8_4_ = 0x42b0c0a5;
                auVar352._0_8_ = 0x42b0c0a542b0c0a5;
                auVar352._12_4_ = 0x42b0c0a5;
                auVar325 = vminps_avx(auVar406,auVar352);
                auVar370._8_4_ = 0xc2b0c0a5;
                auVar370._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar370._12_4_ = 0xc2b0c0a5;
                auVar64 = vmaxps_avx(auVar370,auVar325);
                auVar377._8_4_ = 0x3fb8aa3b;
                auVar377._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar377._12_4_ = 0x3fb8aa3b;
                auVar325 = vfmadd213ps_fma(auVar377,auVar64,auVar320);
                auVar442._0_4_ = (int)auVar325._0_4_;
                auVar442._4_4_ = (int)auVar325._4_4_;
                auVar442._8_4_ = (int)auVar325._8_4_;
                auVar442._12_4_ = (int)auVar325._12_4_;
                auVar223 = vcvtdq2ps_avx(auVar442);
                auVar325 = vcmpps_avx(auVar325,auVar223,1);
                auVar325 = vandps_avx(auVar325,auVar280);
                auVar325 = vsubps_avx(auVar223,auVar325);
                auVar371._8_4_ = 0x3f317218;
                auVar371._0_8_ = 0x3f3172183f317218;
                auVar371._12_4_ = 0x3f317218;
                auVar64 = vfnmadd231ps_fma(auVar64,auVar325,auVar371);
                fVar63 = auVar64._0_4_;
                auVar443._0_4_ = fVar63 * fVar63;
                fVar360 = auVar64._4_4_;
                auVar443._4_4_ = fVar360 * fVar360;
                fVar361 = auVar64._8_4_;
                auVar443._8_4_ = fVar361 * fVar361;
                fVar362 = auVar64._12_4_;
                auVar443._12_4_ = fVar362 * fVar362;
                auVar384._8_4_ = 0x39506967;
                auVar384._0_8_ = 0x3950696739506967;
                auVar384._12_4_ = 0x39506967;
                auVar207._8_4_ = 0x3ab743ce;
                auVar207._0_8_ = 0x3ab743ce3ab743ce;
                auVar207._12_4_ = 0x3ab743ce;
                auVar223 = vfmadd213ps_fma(auVar384,auVar64,auVar207);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar392);
                auVar145._8_4_ = 0x3d2aa9c1;
                auVar145._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar145._12_4_ = 0x3d2aa9c1;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar145);
                auVar353._8_4_ = 0x3e2aaaaa;
                auVar353._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar353._12_4_ = 0x3e2aaaaa;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar353);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar320);
                auVar229._0_4_ = fVar63 + 1.0;
                auVar229._4_4_ = fVar360 + 1.0;
                auVar229._8_4_ = fVar361 + 1.0;
                auVar229._12_4_ = fVar362 + 1.0;
                auVar223 = vfmadd231ps_fma(auVar229,auVar443,auVar223);
                auVar102._0_4_ = (int)auVar325._0_4_;
                auVar102._4_4_ = (int)auVar325._4_4_;
                auVar102._8_4_ = (int)auVar325._8_4_;
                auVar102._12_4_ = (int)auVar325._12_4_;
                auVar325 = vpslld_avx(auVar102,0x17);
                auVar300._8_4_ = 0x3f800000;
                auVar300._0_8_ = 0x3f8000003f800000;
                auVar300._12_4_ = 0x3f800000;
                auVar325 = vpaddd_avx(auVar325,auVar300);
                auVar283 = vfmadd213ps_fma(auVar325,auVar223,auVar280);
                auVar230._8_4_ = 0x800000;
                auVar230._0_8_ = 0x80000000800000;
                auVar230._12_4_ = 0x800000;
                auVar325 = vmaxps_avx(auVar283,auVar230);
                auVar329._8_4_ = 0x807fffff;
                auVar329._0_8_ = 0x807fffff807fffff;
                auVar329._12_4_ = 0x807fffff;
                auVar223 = vpsrld_avx(auVar325,0x17);
                auVar325 = vandps_avx(auVar329,auVar325);
                auVar330._8_4_ = 0x3f000000;
                auVar330._0_8_ = 0x3f0000003f000000;
                auVar330._12_4_ = 0x3f000000;
                auVar64 = vorps_avx(auVar330,auVar325);
                auVar331._8_4_ = 0xffffff82;
                auVar331._0_8_ = 0xffffff82ffffff82;
                auVar331._12_4_ = 0xffffff82;
                auVar180 = vpaddd_avx(auVar223,auVar331);
                auVar268._8_4_ = 0x3f3504f3;
                auVar268._0_8_ = 0x3f3504f33f3504f3;
                auVar268._12_4_ = 0x3f3504f3;
                auVar223 = vcmpps_avx(auVar64,auVar268,1);
                auVar325 = vandps_avx(auVar223,auVar64);
                auVar231._0_4_ = auVar64._0_4_ + -1.0 + auVar325._0_4_;
                auVar231._4_4_ = auVar64._4_4_ + -1.0 + auVar325._4_4_;
                auVar231._8_4_ = auVar64._8_4_ + -1.0 + auVar325._8_4_;
                auVar231._12_4_ = auVar64._12_4_ + -1.0 + auVar325._12_4_;
                auVar64 = vcmpps_avx(auVar283,ZEXT816(0),2);
                auVar180 = vcvtdq2ps_avx(auVar180);
                auVar325 = vandps_avx(auVar223,auVar280);
                auVar325 = vsubps_avx(auVar180,auVar325);
                auVar332._8_4_ = 0x3d9021bb;
                auVar332._0_8_ = 0x3d9021bb3d9021bb;
                auVar332._12_4_ = 0x3d9021bb;
                auVar146._8_4_ = 0xbdebd1b8;
                auVar146._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar146._12_4_ = 0xbdebd1b8;
                auVar223 = vfmadd213ps_fma(auVar332,auVar231,auVar146);
                auVar147._8_4_ = 0x3def251a;
                auVar147._0_8_ = 0x3def251a3def251a;
                auVar147._12_4_ = 0x3def251a;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar147);
                auVar148._8_4_ = 0xbdfe5d4f;
                auVar148._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar148._12_4_ = 0xbdfe5d4f;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar148);
                auVar149._8_4_ = 0x3e11e9bf;
                auVar149._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar149._12_4_ = 0x3e11e9bf;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar149);
                auVar150._8_4_ = 0xbe2aae50;
                auVar150._0_8_ = 0xbe2aae50be2aae50;
                auVar150._12_4_ = 0xbe2aae50;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar150);
                auVar151._8_4_ = 0x3e4cceac;
                auVar151._0_8_ = 0x3e4cceac3e4cceac;
                auVar151._12_4_ = 0x3e4cceac;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar151);
                auVar152._8_4_ = 0xbe7ffffc;
                auVar152._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar152._12_4_ = 0xbe7ffffc;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar152);
                auVar153._8_4_ = 0x3eaaaaaa;
                auVar153._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar153._12_4_ = 0x3eaaaaaa;
                auVar223 = vfmadd213ps_fma(auVar223,auVar231,auVar153);
                auVar223 = vfmsub213ps_fma(auVar223,auVar231,auVar320);
                auVar325 = vfmadd213ps_fma(auVar325,auVar371,auVar231);
                auVar232._0_4_ = auVar231._0_4_ * auVar231._0_4_;
                auVar232._4_4_ = auVar231._4_4_ * auVar231._4_4_;
                auVar232._8_4_ = auVar231._8_4_ * auVar231._8_4_;
                auVar232._12_4_ = auVar231._12_4_ * auVar231._12_4_;
                auVar325 = vfmadd231ps_fma(auVar325,auVar232,auVar223);
                auVar233._0_4_ = auVar325._0_4_ * -2.0;
                auVar233._4_4_ = auVar325._4_4_ * -2.0;
                auVar233._8_4_ = auVar325._8_4_ * -2.0;
                auVar233._12_4_ = auVar325._12_4_ * -2.0;
                auVar154._8_4_ = 0x7fffffff;
                auVar154._0_8_ = 0x7fffffff7fffffff;
                auVar154._12_4_ = 0x7fffffff;
                auVar325 = vblendvps_avx(auVar233,auVar154,auVar64);
                auVar155._8_4_ = 0x42b0c0a5;
                auVar155._0_8_ = 0x42b0c0a542b0c0a5;
                auVar155._12_4_ = 0x42b0c0a5;
                auVar325 = vminps_avx(auVar325,auVar155);
                auVar156._8_4_ = 0xc2b0c0a5;
                auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar156._12_4_ = 0xc2b0c0a5;
                auVar64 = vmaxps_avx(auVar325,auVar156);
                auVar325 = vfmadd213ps_fma(auVar377,auVar64,auVar320);
                auVar269._0_4_ = (int)auVar325._0_4_;
                auVar269._4_4_ = (int)auVar325._4_4_;
                auVar269._8_4_ = (int)auVar325._8_4_;
                auVar269._12_4_ = (int)auVar325._12_4_;
                auVar223 = vcvtdq2ps_avx(auVar269);
                auVar325 = vcmpps_avx(auVar325,auVar223,1);
                auVar325 = vandps_avx(auVar325,auVar280);
                auVar325 = vsubps_avx(auVar223,auVar325);
                auVar64 = vfnmadd231ps_fma(auVar64,auVar325,auVar371);
                fVar63 = auVar64._0_4_;
                auVar270._0_4_ = fVar63 * fVar63;
                fVar360 = auVar64._4_4_;
                auVar270._4_4_ = fVar360 * fVar360;
                fVar361 = auVar64._8_4_;
                auVar270._8_4_ = fVar361 * fVar361;
                fVar362 = auVar64._12_4_;
                auVar270._12_4_ = fVar362 * fVar362;
                auVar157._8_4_ = 0x3ab743ce;
                auVar157._0_8_ = 0x3ab743ce3ab743ce;
                auVar157._12_4_ = 0x3ab743ce;
                auVar223 = vfmadd213ps_fma(auVar384,auVar64,auVar157);
                auVar389 = ZEXT1664(auVar320);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar392);
                auVar158._8_4_ = 0x3d2aa9c1;
                auVar158._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar158._12_4_ = 0x3d2aa9c1;
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar158);
                auVar381 = ZEXT864(0);
                auVar223 = vfmadd213ps_fma(auVar223,auVar64,auVar353);
                auVar320 = vfmadd213ps_fma(auVar223,auVar64,auVar320);
                auVar103._0_4_ = fVar63 + 1.0;
                auVar103._4_4_ = fVar360 + 1.0;
                auVar103._8_4_ = fVar361 + 1.0;
                auVar103._12_4_ = fVar362 + 1.0;
                auVar320 = vfmadd231ps_fma(auVar103,auVar270,auVar320);
                auVar234._0_4_ = (int)auVar325._0_4_;
                auVar234._4_4_ = (int)auVar325._4_4_;
                auVar234._8_4_ = (int)auVar325._8_4_;
                auVar234._12_4_ = (int)auVar325._12_4_;
                auVar325 = vpslld_avx(auVar234,0x17);
                auVar325 = vpaddd_avx(auVar325,auVar300);
                auVar320 = vfmadd213ps_fma(auVar325,auVar320,auVar280);
                auVar325 = vrcpps_avx(auVar320);
                auVar271._0_4_ = auVar325._0_4_ + auVar325._0_4_;
                auVar271._4_4_ = auVar325._4_4_ + auVar325._4_4_;
                auVar271._8_4_ = auVar325._8_4_ + auVar325._8_4_;
                auVar271._12_4_ = auVar325._12_4_ + auVar325._12_4_;
                auVar285._8_4_ = 0x40000000;
                auVar285._0_8_ = 0x4000000040000000;
                auVar285._12_4_ = 0x40000000;
                auVar320 = vfmsub213ps_fma(auVar320,auVar271,auVar285);
                auVar325 = vfnmadd213ps_fma(auVar320,auVar325,auVar271);
                auVar406 = vfmsub231ps_fma(auVar406,auVar406,auVar325);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar111._4_4_ = uVar1;
                auVar111._0_4_ = uVar1;
                auVar111._8_4_ = uVar1;
                auVar111._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar235._4_4_ = uVar1;
                auVar235._0_4_ = uVar1;
                auVar235._8_4_ = uVar1;
                auVar235._12_4_ = uVar1;
                auVar320 = vfmadd231ps_fma(auVar235,auVar406,auVar111);
                auVar325 = vmaxps_avx(auVar320,auVar325);
                auVar325 = vminps_avx(auVar325,auVar280);
                auVar406._0_4_ = auVar406._0_4_ * auVar325._0_4_;
                auVar406._4_4_ = fVar63 * auVar325._4_4_;
                auVar406._8_4_ = fVar360 * auVar325._8_4_;
                auVar406._12_4_ = fVar361 * auVar325._12_4_;
              }
              *pauVar45 = auVar406;
              pauVar45 = pauVar45 + 1;
              bVar59 = iVar37 != iVar3;
              iVar37 = iVar37 + 1;
            } while (bVar59);
          }
          uVar49 = uVar49 + 1;
        } while (uVar49 != uVar32);
      }
      if (iVar2 == 4 && (bVar58 && bVar60)) {
        local_58 = top_blob->data;
        local_60 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_68 = (this->weight_data_packed).data;
        local_70 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_50 = (ulong)uVar32;
        local_150 = 0;
        do {
          pvVar31 = local_58;
          pvVar29 = local_b8.data;
          if (-1 < iVar3) {
            lVar53 = local_60 * local_150;
            pfVar33 = (float *)(local_70 * local_150 + (long)local_68);
            lVar55 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar37 = 0;
            uVar49 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar381 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                            local_150 * 4));
              }
              auVar325 = auVar381._0_16_;
              if (0 < iVar30) {
                p_Var7 = pp_Var6[-3];
                pfVar40 = (float *)((long)(_func_int ***)pvVar29 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var7) * iVar37) * 4);
                uVar47 = 0;
                pfVar46 = pfVar33;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var7)) {
                    pfVar51 = pfVar40;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var7);
                    do {
                      auVar112._0_4_ = *pfVar46 * *pfVar51;
                      auVar112._4_4_ = pfVar46[1] * pfVar51[1];
                      auVar112._8_4_ = pfVar46[2] * pfVar51[2];
                      auVar112._12_4_ = pfVar46[3] * pfVar51[3];
                      auVar325 = vshufpd_avx(auVar112,auVar112,1);
                      auVar113._0_4_ = auVar325._0_4_ + auVar112._0_4_;
                      auVar113._4_4_ = auVar325._4_4_ + auVar112._4_4_;
                      auVar113._8_4_ = auVar325._8_4_ + auVar112._8_4_;
                      auVar113._12_4_ = auVar325._12_4_ + auVar112._12_4_;
                      auVar325 = vmovshdup_avx(auVar113);
                      auVar381 = ZEXT464((uint)(auVar325._0_4_ + auVar381._0_4_ + auVar113._0_4_));
                      pfVar46 = pfVar46 + 4;
                      pfVar51 = pfVar51 + (*(int *)(&this->field_0xd8 + (long)p_Var7) << 2);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar325 = auVar381._0_16_;
                  uVar47 = uVar47 + 1;
                  pfVar40 = (float *)((long)pfVar40 + lVar55);
                } while (uVar47 != uVar54);
              }
              fVar360 = auVar325._0_4_;
              fVar63 = fVar360;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar325 = vmaxss_avx(auVar325,ZEXT416(0));
                fVar63 = auVar325._0_4_;
                break;
              case 2:
                auVar325 = vcmpss_avx(ZEXT816(0) << 0x40,auVar325,1);
                auVar208._8_4_ = 0x3f800000;
                auVar208._0_8_ = 0x3f8000003f800000;
                auVar208._12_4_ = 0x3f800000;
                auVar325 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar208,auVar325);
                fVar63 = auVar325._0_4_ * fVar360;
                break;
              case 3:
                auVar325 = vmaxss_avx(auVar325,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar325 = vminss_avx(auVar325,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar63 = auVar325._0_4_;
                break;
              case 4:
                fVar63 = expf(-fVar360);
                fVar63 = 1.0 / (fVar63 + 1.0);
                break;
              case 5:
                local_48 = auVar325;
                fVar63 = expf(fVar360);
                fVar63 = logf(fVar63 + 1.0);
                fVar63 = tanhf(fVar63);
                fVar63 = fVar63 * (float)local_48._0_4_;
                break;
              case 6:
                fVar361 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar362 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar221 = -fVar362 / fVar361;
                fVar63 = 0.0;
                if ((fVar221 <= fVar360) && (fVar63 = fVar360, fVar360 <= fVar221 + 1.0 / fVar361))
                {
                  auVar325 = vfmadd213ss_fma(ZEXT416((uint)fVar361),auVar325,ZEXT416((uint)fVar362))
                  ;
                  fVar63 = auVar325._0_4_ * fVar360;
                }
              }
              *(float *)((long)pvVar31 + uVar49 * 4 + lVar53) = fVar63;
              uVar49 = uVar49 + 1;
              iVar37 = iVar37 + 4;
            } while (uVar49 != _w);
          }
          local_150 = local_150 + 1;
        } while (local_150 != local_50);
      }
      if ((bVar58 && bVar60) && iVar2 == 1) {
        local_48._0_8_ = top_blob->data;
        iVar2 = top_blob->w;
        sVar8 = top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        uVar49 = 0;
        do {
          pvVar29 = local_b8.data;
          if (-1 < iVar3) {
            lVar53 = (long)iVar2 * sVar8 * uVar49 + local_48._0_8_;
            lVar55 = (long)local_b8.w * local_b8.elemsize;
            uVar47 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar381 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar381 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                            uVar49 * 4));
              }
              auVar325 = auVar381._0_16_;
              if (0 < iVar30) {
                iVar37 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                puVar36 = (uint *)((long)((int)uVar49 * iVar30 * iVar37) * 4 +
                                  *(long *)(&this->field_0x148 + (long)p_Var4));
                puVar41 = (uint *)((long)(_func_int ***)pvVar29 +
                                  (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)uVar47) *
                                  4);
                uVar42 = 0;
                do {
                  if (0 < iVar37) {
                    puVar48 = puVar41;
                    iVar52 = iVar37;
                    do {
                      auVar325 = vfmadd231ss_fma(auVar381._0_16_,ZEXT416(*puVar36),ZEXT416(*puVar48)
                                                );
                      auVar381 = ZEXT1664(auVar325);
                      puVar36 = puVar36 + 1;
                      puVar48 = puVar48 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar325 = auVar381._0_16_;
                  uVar42 = uVar42 + 1;
                  puVar41 = (uint *)((long)puVar41 + lVar55);
                } while (uVar42 != uVar54);
              }
              fVar360 = auVar325._0_4_;
              fVar63 = fVar360;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar325 = vmaxss_avx(auVar325,ZEXT416(0));
                fVar63 = auVar325._0_4_;
                break;
              case 2:
                auVar325 = vcmpss_avx(ZEXT816(0) << 0x40,auVar325,1);
                auVar209._8_4_ = 0x3f800000;
                auVar209._0_8_ = 0x3f8000003f800000;
                auVar209._12_4_ = 0x3f800000;
                auVar325 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar209,auVar325);
                fVar63 = auVar325._0_4_ * fVar360;
                break;
              case 3:
                auVar325 = vmaxss_avx(auVar325,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar325 = vminss_avx(auVar325,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar63 = auVar325._0_4_;
                break;
              case 4:
                fVar63 = expf(-fVar360);
                fVar63 = 1.0 / (fVar63 + 1.0);
                break;
              case 5:
                fVar63 = expf(fVar360);
                fVar63 = logf(fVar63 + 1.0);
                fVar63 = tanhf(fVar63);
                fVar63 = fVar63 * fVar360;
                break;
              case 6:
                fVar361 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar362 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar221 = -fVar362 / fVar361;
                fVar63 = 0.0;
                if ((fVar221 <= fVar360) && (fVar63 = fVar360, fVar360 <= fVar221 + 1.0 / fVar361))
                {
                  auVar325 = vfmadd213ss_fma(ZEXT416((uint)fVar361),auVar325,ZEXT416((uint)fVar362))
                  ;
                  fVar63 = auVar325._0_4_ * fVar360;
                }
              }
              *(float *)(lVar53 + uVar47 * 4) = fVar63;
              uVar47 = uVar47 + 1;
            } while (uVar47 != _w);
          }
          uVar49 = uVar49 + 1;
        } while (uVar49 != uVar32);
      }
      iVar52 = 0;
    }
  }
  piVar28 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar52;
}

Assistant:

int Convolution1D_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}